

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  byte bVar59;
  ulong uVar60;
  bool bVar61;
  Geometry *geometry;
  long lVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  ulong uVar66;
  float fVar67;
  float fVar68;
  float fVar113;
  float fVar115;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar76 [16];
  float fVar114;
  float fVar116;
  float fVar118;
  float fVar119;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar117;
  float fVar120;
  float fVar121;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined4 uVar122;
  float fVar129;
  float fVar130;
  vint4 bi_2;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined8 uVar132;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vint4 ai_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar161;
  vint4 ai_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  LinearSpace3fa *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined8 local_2c0;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar175 [64];
  
  PVar8 = prim[1];
  uVar60 = (ulong)(byte)PVar8;
  fVar140 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar73 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar141._0_4_ = fVar140 * auVar73._0_4_;
  auVar141._4_4_ = fVar140 * auVar73._4_4_;
  auVar141._8_4_ = fVar140 * auVar73._8_4_;
  auVar141._12_4_ = fVar140 * auVar73._12_4_;
  auVar76._0_4_ = fVar140 * auVar71._0_4_;
  auVar76._4_4_ = fVar140 * auVar71._4_4_;
  auVar76._8_4_ = fVar140 * auVar71._8_4_;
  auVar76._12_4_ = fVar140 * auVar71._12_4_;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar60 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar64 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + uVar60 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar66 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar171._4_4_ = auVar76._0_4_;
  auVar171._0_4_ = auVar76._0_4_;
  auVar171._8_4_ = auVar76._0_4_;
  auVar171._12_4_ = auVar76._0_4_;
  auVar22 = vshufps_avx(auVar76,auVar76,0x55);
  auVar72 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar140 = auVar72._0_4_;
  auVar136._0_4_ = fVar140 * auVar184._0_4_;
  fVar129 = auVar72._4_4_;
  auVar136._4_4_ = fVar129 * auVar184._4_4_;
  fVar130 = auVar72._8_4_;
  auVar136._8_4_ = fVar130 * auVar184._8_4_;
  fVar131 = auVar72._12_4_;
  auVar136._12_4_ = fVar131 * auVar184._12_4_;
  auVar133._0_4_ = auVar19._0_4_ * fVar140;
  auVar133._4_4_ = auVar19._4_4_ * fVar129;
  auVar133._8_4_ = auVar19._8_4_ * fVar130;
  auVar133._12_4_ = auVar19._12_4_ * fVar131;
  auVar123._0_4_ = auVar75._0_4_ * fVar140;
  auVar123._4_4_ = auVar75._4_4_ * fVar129;
  auVar123._8_4_ = auVar75._8_4_ * fVar130;
  auVar123._12_4_ = auVar75._12_4_ * fVar131;
  auVar72 = vfmadd231ps_fma(auVar136,auVar22,auVar71);
  auVar70 = vfmadd231ps_fma(auVar133,auVar22,auVar74);
  auVar22 = vfmadd231ps_fma(auVar123,auVar21,auVar22);
  auVar69 = vfmadd231ps_fma(auVar72,auVar171,auVar73);
  auVar70 = vfmadd231ps_fma(auVar70,auVar171,auVar18);
  auVar76 = vfmadd231ps_fma(auVar22,auVar20,auVar171);
  auVar172._4_4_ = auVar141._0_4_;
  auVar172._0_4_ = auVar141._0_4_;
  auVar172._8_4_ = auVar141._0_4_;
  auVar172._12_4_ = auVar141._0_4_;
  auVar22 = vshufps_avx(auVar141,auVar141,0x55);
  auVar72 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar140 = auVar72._0_4_;
  auVar176._0_4_ = fVar140 * auVar184._0_4_;
  fVar129 = auVar72._4_4_;
  auVar176._4_4_ = fVar129 * auVar184._4_4_;
  fVar130 = auVar72._8_4_;
  auVar176._8_4_ = fVar130 * auVar184._8_4_;
  fVar131 = auVar72._12_4_;
  auVar176._12_4_ = fVar131 * auVar184._12_4_;
  auVar148._0_4_ = auVar19._0_4_ * fVar140;
  auVar148._4_4_ = auVar19._4_4_ * fVar129;
  auVar148._8_4_ = auVar19._8_4_ * fVar130;
  auVar148._12_4_ = auVar19._12_4_ * fVar131;
  auVar142._0_4_ = auVar75._0_4_ * fVar140;
  auVar142._4_4_ = auVar75._4_4_ * fVar129;
  auVar142._8_4_ = auVar75._8_4_ * fVar130;
  auVar142._12_4_ = auVar75._12_4_ * fVar131;
  auVar71 = vfmadd231ps_fma(auVar176,auVar22,auVar71);
  auVar184 = vfmadd231ps_fma(auVar148,auVar22,auVar74);
  auVar74 = vfmadd231ps_fma(auVar142,auVar22,auVar21);
  auVar19 = vfmadd231ps_fma(auVar71,auVar172,auVar73);
  auVar21 = vfmadd231ps_fma(auVar184,auVar172,auVar18);
  auVar162._8_4_ = 0x7fffffff;
  auVar162._0_8_ = 0x7fffffff7fffffff;
  auVar162._12_4_ = 0x7fffffff;
  auVar75 = vfmadd231ps_fma(auVar74,auVar172,auVar20);
  auVar73 = vandps_avx(auVar69,auVar162);
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar73,auVar158,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar72._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar69._12_4_;
  auVar73 = vandps_avx(auVar70,auVar162);
  uVar64 = vcmpps_avx512vl(auVar73,auVar158,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar69._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar70._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar70._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar70._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar70._12_4_;
  auVar73 = vandps_avx(auVar76,auVar162);
  uVar64 = vcmpps_avx512vl(auVar73,auVar158,1);
  bVar61 = (bool)((byte)uVar64 & 1);
  auVar70._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._0_4_;
  bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._4_4_;
  bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._8_4_;
  bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._12_4_;
  auVar71 = vrcp14ps_avx512vl(auVar72);
  auVar159._8_4_ = 0x3f800000;
  auVar159._0_8_ = 0x3f8000003f800000;
  auVar159._12_4_ = 0x3f800000;
  auVar73 = vfnmadd213ps_fma(auVar72,auVar71,auVar159);
  auVar18 = vfmadd132ps_fma(auVar73,auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar69);
  auVar73 = vfnmadd213ps_fma(auVar69,auVar71,auVar159);
  auVar74 = vfmadd132ps_fma(auVar73,auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar70);
  auVar73 = vfnmadd213ps_fma(auVar70,auVar71,auVar159);
  auVar20 = vfmadd132ps_fma(auVar73,auVar71,auVar71);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar19);
  auVar154._0_4_ = auVar18._0_4_ * auVar73._0_4_;
  auVar154._4_4_ = auVar18._4_4_ * auVar73._4_4_;
  auVar154._8_4_ = auVar18._8_4_ * auVar73._8_4_;
  auVar154._12_4_ = auVar18._12_4_ * auVar73._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar71);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar19);
  auVar72 = vpbroadcastd_avx512vl();
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar71 = vpmovsxwd_avx(auVar184);
  auVar137._0_4_ = auVar18._0_4_ * auVar73._0_4_;
  auVar137._4_4_ = auVar18._4_4_ * auVar73._4_4_;
  auVar137._8_4_ = auVar18._8_4_ * auVar73._8_4_;
  auVar137._12_4_ = auVar18._12_4_ * auVar73._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar60 * -2 + 6);
  auVar73 = vpmovsxwd_avx(auVar18);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar21);
  auVar160._0_4_ = auVar74._0_4_ * auVar73._0_4_;
  auVar160._4_4_ = auVar74._4_4_ * auVar73._4_4_;
  auVar160._8_4_ = auVar74._8_4_ * auVar73._8_4_;
  auVar160._12_4_ = auVar74._12_4_ * auVar73._12_4_;
  auVar73 = vcvtdq2ps_avx(auVar71);
  auVar73 = vsubps_avx(auVar73,auVar21);
  auVar134._0_4_ = auVar74._0_4_ * auVar73._0_4_;
  auVar134._4_4_ = auVar74._4_4_ * auVar73._4_4_;
  auVar134._8_4_ = auVar74._8_4_ * auVar73._8_4_;
  auVar134._12_4_ = auVar74._12_4_ * auVar73._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar66 + uVar60 + 6);
  auVar73 = vpmovsxwd_avx(auVar74);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar75);
  auVar149._0_4_ = auVar20._0_4_ * auVar73._0_4_;
  auVar149._4_4_ = auVar20._4_4_ * auVar73._4_4_;
  auVar149._8_4_ = auVar20._8_4_ * auVar73._8_4_;
  auVar149._12_4_ = auVar20._12_4_ * auVar73._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar73 = vpmovsxwd_avx(auVar19);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar75);
  auVar124._0_4_ = auVar20._0_4_ * auVar73._0_4_;
  auVar124._4_4_ = auVar20._4_4_ * auVar73._4_4_;
  auVar124._8_4_ = auVar20._8_4_ * auVar73._8_4_;
  auVar124._12_4_ = auVar20._12_4_ * auVar73._12_4_;
  auVar73 = vpminsd_avx(auVar154,auVar137);
  auVar71 = vpminsd_avx(auVar160,auVar134);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71 = vpminsd_avx(auVar149,auVar124);
  uVar122 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar20._4_4_ = uVar122;
  auVar20._0_4_ = uVar122;
  auVar20._8_4_ = uVar122;
  auVar20._12_4_ = uVar122;
  auVar71 = vmaxps_avx512vl(auVar71,auVar20);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_290 = vmulps_avx512vl(auVar73,auVar21);
  auVar73 = vpmaxsd_avx(auVar154,auVar137);
  auVar71 = vpmaxsd_avx(auVar160,auVar134);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar71 = vpmaxsd_avx(auVar149,auVar124);
  uVar122 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar75._4_4_ = uVar122;
  auVar75._0_4_ = uVar122;
  auVar75._8_4_ = uVar122;
  auVar75._12_4_ = uVar122;
  auVar71 = vminps_avx512vl(auVar71,auVar75);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar22._8_4_ = 0x3f800003;
  auVar22._0_8_ = 0x3f8000033f800003;
  auVar22._12_4_ = 0x3f800003;
  auVar73 = vmulps_avx512vl(auVar73,auVar22);
  uVar132 = vcmpps_avx512vl(local_290,auVar73,2);
  uVar64 = vpcmpgtd_avx512vl(auVar72,_DAT_01f7fcf0);
  uVar64 = ((byte)uVar132 & 0xf) & uVar64;
  if ((char)uVar64 == '\0') {
    bVar61 = false;
  }
  else {
    local_468 = pre->ray_space + k;
    local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar24 = 0;
      for (uVar66 = uVar64; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_5e8 = (ulong)*(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[local_5e8].ptr;
      local_530._0_8_ = CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6));
      uVar66 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6)));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar10[1].time_range.upper;
      local_5e0 = *(undefined1 (*) [16])(lVar24 + (long)p_Var11 * uVar66);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar66 + 1) * (long)p_Var11);
      local_5c0 = *(undefined8 *)*pauVar3;
      uStack_5b8 = *(undefined8 *)(*pauVar3 + 8);
      auVar73 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar66 + 2) * (long)p_Var11);
      local_5d0 = *(undefined8 *)*pauVar4;
      uStack_5c8 = *(undefined8 *)(*pauVar4 + 8);
      auVar71 = *pauVar4;
      uVar64 = uVar64 - 1 & uVar64;
      pauVar5 = (undefined1 (*) [12])(lVar24 + (uVar66 + 3) * (long)p_Var11);
      local_480 = (float)*(undefined8 *)*pauVar5;
      fStack_47c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_478 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_474 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar64 != 0) {
        uVar60 = uVar64 - 1 & uVar64;
        for (uVar66 = uVar64; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        }
        if (uVar60 != 0) {
          for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar184 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar74 = vsubps_avx(local_5e0,auVar184);
      uVar122 = auVar74._0_4_;
      auVar138._4_4_ = uVar122;
      auVar138._0_4_ = uVar122;
      auVar138._8_4_ = uVar122;
      auVar138._12_4_ = uVar122;
      auVar18 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      aVar6 = (local_468->vx).field_0;
      aVar7 = (local_468->vy).field_0;
      fVar140 = (local_468->vz).field_0.m128[0];
      fVar129 = *(float *)((long)&(local_468->vz).field_0 + 4);
      fVar130 = *(float *)((long)&(local_468->vz).field_0 + 8);
      fVar131 = *(float *)((long)&(local_468->vz).field_0 + 0xc);
      auVar166._0_4_ = fVar140 * auVar74._0_4_;
      auVar166._4_4_ = fVar129 * auVar74._4_4_;
      auVar166._8_4_ = fVar130 * auVar74._8_4_;
      auVar166._12_4_ = fVar131 * auVar74._12_4_;
      auVar18 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar7,auVar18);
      auVar20 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar6,auVar138);
      auVar18 = vshufps_avx(local_5e0,local_5e0,0xff);
      auVar19 = vsubps_avx(auVar73,auVar184);
      uVar122 = auVar19._0_4_;
      auVar143._4_4_ = uVar122;
      auVar143._0_4_ = uVar122;
      auVar143._8_4_ = uVar122;
      auVar143._12_4_ = uVar122;
      auVar74 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar167._0_4_ = fVar140 * auVar19._0_4_;
      auVar167._4_4_ = fVar129 * auVar19._4_4_;
      auVar167._8_4_ = fVar130 * auVar19._8_4_;
      auVar167._12_4_ = fVar131 * auVar19._12_4_;
      auVar74 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar7,auVar74);
      auVar21 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar143);
      auVar73 = vshufps_avx(auVar73,auVar73,0xff);
      auVar19 = vsubps_avx(auVar71,auVar184);
      uVar122 = auVar19._0_4_;
      auVar163._4_4_ = uVar122;
      auVar163._0_4_ = uVar122;
      auVar163._8_4_ = uVar122;
      auVar163._12_4_ = uVar122;
      auVar74 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar169._0_4_ = fVar140 * auVar19._0_4_;
      auVar169._4_4_ = fVar129 * auVar19._4_4_;
      auVar169._8_4_ = fVar130 * auVar19._8_4_;
      auVar169._12_4_ = fVar131 * auVar19._12_4_;
      auVar74 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar7,auVar74);
      auVar19 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar163);
      auVar71 = vshufps_avx(auVar71,auVar71,0xff);
      auVar57._12_4_ = fStack_474;
      auVar57._0_12_ = *pauVar5;
      auVar74 = vsubps_avx512vl(auVar57,auVar184);
      uVar122 = auVar74._0_4_;
      auVar144._4_4_ = uVar122;
      auVar144._0_4_ = uVar122;
      auVar144._8_4_ = uVar122;
      auVar144._12_4_ = uVar122;
      auVar184 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar170._0_4_ = fVar140 * auVar74._0_4_;
      auVar170._4_4_ = fVar129 * auVar74._4_4_;
      auVar170._8_4_ = fVar130 * auVar74._8_4_;
      auVar170._12_4_ = fVar131 * auVar74._12_4_;
      auVar184 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar7,auVar184);
      auVar184 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar6,auVar144);
      lVar24 = (long)iVar9 * 0x44;
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      auVar74 = vshufps_avx512vl(auVar57,auVar57,0xff);
      local_400 = vbroadcastss_avx512vl(auVar20);
      auVar77._8_4_ = 1;
      auVar77._0_8_ = 0x100000001;
      auVar77._12_4_ = 1;
      auVar77._16_4_ = 1;
      auVar77._20_4_ = 1;
      auVar77._24_4_ = 1;
      auVar77._28_4_ = 1;
      local_3e0 = vpermps_avx512vl(auVar77,ZEXT1632(auVar20));
      uVar132 = auVar18._0_8_;
      local_80._8_8_ = uVar132;
      local_80._0_8_ = uVar132;
      local_80._16_8_ = uVar132;
      local_80._24_8_ = uVar132;
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      uVar122 = auVar21._0_4_;
      local_560._4_4_ = uVar122;
      local_560._0_4_ = uVar122;
      local_560._8_4_ = uVar122;
      local_560._12_4_ = uVar122;
      local_560._16_4_ = uVar122;
      local_560._20_4_ = uVar122;
      local_560._24_4_ = uVar122;
      local_560._28_4_ = uVar122;
      local_520 = vpermps_avx512vl(auVar77,ZEXT1632(auVar21));
      uVar132 = auVar73._0_8_;
      local_a0._8_8_ = uVar132;
      local_a0._0_8_ = uVar132;
      local_a0._16_8_ = uVar132;
      local_a0._24_8_ = uVar132;
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar19);
      local_420 = vpermps_avx2(auVar77,ZEXT1632(auVar19));
      local_c0 = vbroadcastsd_avx512vl(auVar71);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar184);
      auVar188 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar77,ZEXT1632(auVar184));
      auVar189 = ZEXT3264(local_500);
      _local_e0 = vbroadcastsd_avx512vl(auVar74);
      auVar77 = vmulps_avx512vl(local_4e0,auVar91);
      auVar78 = vmulps_avx512vl(local_500,auVar91);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar92,local_4c0);
      auVar73 = vfmadd231ps_fma(auVar78,auVar92,local_420);
      auVar71 = vfmadd231ps_fma(auVar77,auVar94,local_560);
      auVar79 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar94,local_520);
      auVar80 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar93,local_400);
      auVar77 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar78 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar81 = vfmadd231ps_avx512vl(auVar79,auVar93,local_3e0);
      auVar79 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      auVar82 = vmulps_avx512vl(local_4e0,auVar90);
      auVar83 = vmulps_avx512vl(local_500,auVar90);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,local_4c0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,local_420);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar78,local_560);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar78,local_520);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar77,local_400);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar77,local_3e0);
      auVar84 = vsubps_avx512vl(auVar82,auVar80);
      auVar85 = vsubps_avx512vl(auVar83,auVar81);
      auVar86 = vmulps_avx512vl(auVar81,auVar84);
      auVar87 = vmulps_avx512vl(auVar80,auVar85);
      auVar86 = vsubps_avx512vl(auVar86,auVar87);
      auVar87 = vmulps_avx512vl(_local_e0,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_c0);
      auVar73 = vfmadd231ps_fma(auVar87,auVar94,local_a0);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar93,local_80);
      auVar88 = vmulps_avx512vl(_local_e0,auVar90);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar79,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar78,local_a0);
      auVar18 = vfmadd231ps_fma(auVar88,auVar77,local_80);
      auVar88 = vmulps_avx512vl(auVar85,auVar85);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,auVar84);
      auVar89 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar18));
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      auVar88 = vmulps_avx512vl(auVar89,auVar88);
      auVar86 = vmulps_avx512vl(auVar86,auVar86);
      uVar132 = vcmpps_avx512vl(auVar86,auVar88,2);
      auVar73 = vblendps_avx(auVar20,local_5e0,8);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar71 = vandps_avx512vl(auVar73,auVar74);
      auVar73 = vblendps_avx(auVar21,*pauVar3,8);
      auVar73 = vandps_avx512vl(auVar73,auVar74);
      auVar71 = vmaxps_avx(auVar71,auVar73);
      auVar73 = vblendps_avx(auVar19,*pauVar4,8);
      auVar75 = vandps_avx512vl(auVar73,auVar74);
      auVar73 = vblendps_avx(auVar184,auVar57,8);
      auVar73 = vandps_avx512vl(auVar73,auVar74);
      auVar73 = vmaxps_avx(auVar75,auVar73);
      auVar73 = vmaxps_avx(auVar71,auVar73);
      auVar71 = vmovshdup_avx(auVar73);
      auVar71 = vmaxss_avx(auVar71,auVar73);
      auVar73 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar73,auVar71);
      local_540._0_4_ = (undefined4)iVar9;
      local_540._4_12_ = auVar20._4_12_;
      auVar88._4_4_ = local_540._0_4_;
      auVar88._0_4_ = local_540._0_4_;
      auVar88._8_4_ = local_540._0_4_;
      auVar88._12_4_ = local_540._0_4_;
      auVar88._16_4_ = local_540._0_4_;
      auVar88._20_4_ = local_540._0_4_;
      auVar88._24_4_ = local_540._0_4_;
      auVar88._28_4_ = local_540._0_4_;
      uVar23 = vcmpps_avx512vl(auVar88,_DAT_01faff40,0xe);
      bVar65 = (byte)uVar132 & (byte)uVar23;
      auVar73 = vmulss_avx512f(auVar73,ZEXT416(0x35000000));
      auVar86._8_4_ = 2;
      auVar86._0_8_ = 0x200000002;
      auVar86._12_4_ = 2;
      auVar86._16_4_ = 2;
      auVar86._20_4_ = 2;
      auVar86._24_4_ = 2;
      auVar86._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar86,ZEXT1632(auVar20));
      local_120 = vpermps_avx512vl(auVar86,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar86,ZEXT1632(auVar19));
      local_4a0 = vpermps_avx2(auVar86,ZEXT1632(auVar184));
      uVar63 = *(uint *)(ray + k * 4 + 0x30);
      auVar71 = auVar84._0_16_;
      if (bVar65 == 0) {
        bVar61 = false;
        auVar71 = vxorps_avx512vl(auVar71,auVar71);
        auVar185 = ZEXT1664(auVar71);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar181 = ZEXT3264(auVar93);
        auVar182 = ZEXT3264(local_400);
        auVar183 = ZEXT3264(local_3e0);
        auVar179 = ZEXT3264(local_560);
        auVar180 = ZEXT3264(local_520);
        auVar186 = ZEXT3264(local_4c0);
        auVar187 = ZEXT3264(local_420);
      }
      else {
        local_440._0_16_ = ZEXT416(uVar63);
        local_3c0._0_16_ = auVar73;
        auVar90 = vmulps_avx512vl(local_4a0,auVar90);
        auVar79 = vfmadd213ps_avx512vl(auVar79,local_140,auVar90);
        auVar78 = vfmadd213ps_avx512vl(auVar78,local_120,auVar79);
        auVar90 = vfmadd213ps_avx512vl(auVar77,local_100,auVar78);
        auVar91 = vmulps_avx512vl(local_4a0,auVar91);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar91);
        auVar78 = vfmadd213ps_avx512vl(auVar94,local_120,auVar92);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        auVar77 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1f9c);
        auVar86 = vfmadd213ps_avx512vl(auVar93,local_100,auVar78);
        auVar93 = vmulps_avx512vl(local_4e0,auVar77);
        auVar78 = vmulps_avx512vl(local_500,auVar77);
        auVar77 = vmulps_avx512vl(local_4a0,auVar77);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_4c0);
        auVar184 = vfmadd231ps_fma(auVar78,auVar91,local_420);
        auVar91 = vfmadd231ps_avx512vl(auVar77,local_140,auVar91);
        auVar74 = vfmadd231ps_fma(auVar93,auVar92,local_560);
        auVar180 = ZEXT3264(local_520);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar92,local_520);
        auVar77 = vfmadd231ps_avx512vl(auVar91,local_120,auVar92);
        auVar78 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,local_400);
        auVar79 = vfmadd231ps_avx512vl(auVar93,auVar94,local_3e0);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1f9c);
        auVar77 = vfmadd231ps_avx512vl(auVar77,local_100,auVar94);
        auVar94 = vmulps_avx512vl(local_4e0,auVar91);
        auVar88 = vmulps_avx512vl(local_500,auVar91);
        auVar91 = vmulps_avx512vl(local_4a0,auVar91);
        auVar190 = ZEXT1664(auVar73);
        auVar89 = vfmadd231ps_avx512vl(auVar94,auVar92,local_4c0);
        auVar184 = vfmadd231ps_fma(auVar88,auVar92,local_420);
        auVar187 = ZEXT3264(local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar91,local_140,auVar92);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar91 = vfmadd231ps_avx512vl(auVar89,auVar94,local_560);
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar94,local_520);
        auVar94 = vfmadd231ps_avx512vl(auVar92,local_120,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar91,auVar93,local_400);
        auVar91 = vfmadd231ps_avx512vl(auVar88,auVar93,local_3e0);
        auVar88 = vfmadd231ps_avx512vl(auVar94,local_100,auVar93);
        auVar177._8_4_ = 0x7fffffff;
        auVar177._0_8_ = 0x7fffffff7fffffff;
        auVar177._12_4_ = 0x7fffffff;
        auVar177._16_4_ = 0x7fffffff;
        auVar177._20_4_ = 0x7fffffff;
        auVar177._24_4_ = 0x7fffffff;
        auVar177._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar78,auVar177);
        auVar94 = vandps_avx(auVar79,auVar177);
        auVar94 = vmaxps_avx(auVar93,auVar94);
        auVar93 = vandps_avx(auVar77,auVar177);
        auVar93 = vmaxps_avx(auVar94,auVar93);
        auVar77 = vbroadcastss_avx512vl(auVar73);
        uVar66 = vcmpps_avx512vl(auVar93,auVar77,1);
        bVar61 = (bool)((byte)uVar66 & 1);
        auVar89._0_4_ = (float)((uint)bVar61 * auVar84._0_4_ | (uint)!bVar61 * auVar78._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar89._4_4_ = (float)((uint)bVar61 * auVar84._4_4_ | (uint)!bVar61 * auVar78._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar89._8_4_ = (float)((uint)bVar61 * auVar84._8_4_ | (uint)!bVar61 * auVar78._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar89._12_4_ = (float)((uint)bVar61 * auVar84._12_4_ | (uint)!bVar61 * auVar78._12_4_);
        bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar89._16_4_ = (float)((uint)bVar61 * auVar84._16_4_ | (uint)!bVar61 * auVar78._16_4_);
        bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar89._20_4_ = (float)((uint)bVar61 * auVar84._20_4_ | (uint)!bVar61 * auVar78._20_4_);
        bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar89._24_4_ = (float)((uint)bVar61 * auVar84._24_4_ | (uint)!bVar61 * auVar78._24_4_);
        bVar61 = SUB81(uVar66 >> 7,0);
        auVar89._28_4_ = (uint)bVar61 * auVar84._28_4_ | (uint)!bVar61 * auVar78._28_4_;
        bVar61 = (bool)((byte)uVar66 & 1);
        auVar95._0_4_ = (float)((uint)bVar61 * auVar85._0_4_ | (uint)!bVar61 * auVar79._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar79._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar79._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar79._12_4_);
        bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar61 * auVar85._16_4_ | (uint)!bVar61 * auVar79._16_4_);
        bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar61 * auVar85._20_4_ | (uint)!bVar61 * auVar79._20_4_);
        bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar61 * auVar85._24_4_ | (uint)!bVar61 * auVar79._24_4_);
        bVar61 = SUB81(uVar66 >> 7,0);
        auVar95._28_4_ = (uint)bVar61 * auVar85._28_4_ | (uint)!bVar61 * auVar79._28_4_;
        auVar93 = vandps_avx(auVar177,auVar92);
        auVar94 = vandps_avx(auVar91,auVar177);
        auVar94 = vmaxps_avx(auVar93,auVar94);
        auVar93 = vandps_avx(auVar88,auVar177);
        auVar93 = vmaxps_avx(auVar94,auVar93);
        uVar66 = vcmpps_avx512vl(auVar93,auVar77,1);
        bVar61 = (bool)((byte)uVar66 & 1);
        auVar96._0_4_ = (float)((uint)bVar61 * auVar84._0_4_ | (uint)!bVar61 * auVar92._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar61 * auVar84._4_4_ | (uint)!bVar61 * auVar92._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar61 * auVar84._8_4_ | (uint)!bVar61 * auVar92._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar61 * auVar84._12_4_ | (uint)!bVar61 * auVar92._12_4_);
        bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar61 * auVar84._16_4_ | (uint)!bVar61 * auVar92._16_4_);
        bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar61 * auVar84._20_4_ | (uint)!bVar61 * auVar92._20_4_);
        bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar61 * auVar84._24_4_ | (uint)!bVar61 * auVar92._24_4_);
        bVar61 = SUB81(uVar66 >> 7,0);
        auVar96._28_4_ = (uint)bVar61 * auVar84._28_4_ | (uint)!bVar61 * auVar92._28_4_;
        bVar61 = (bool)((byte)uVar66 & 1);
        auVar84._0_4_ = (float)((uint)bVar61 * auVar85._0_4_ | (uint)!bVar61 * auVar91._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar84._4_4_ = (float)((uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar91._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar84._8_4_ = (float)((uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar91._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar84._12_4_ = (float)((uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar91._12_4_);
        bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar84._16_4_ = (float)((uint)bVar61 * auVar85._16_4_ | (uint)!bVar61 * auVar91._16_4_);
        bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar84._20_4_ = (float)((uint)bVar61 * auVar85._20_4_ | (uint)!bVar61 * auVar91._20_4_);
        bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar84._24_4_ = (float)((uint)bVar61 * auVar85._24_4_ | (uint)!bVar61 * auVar91._24_4_);
        bVar61 = SUB81(uVar66 >> 7,0);
        auVar84._28_4_ = (uint)bVar61 * auVar85._28_4_ | (uint)!bVar61 * auVar91._28_4_;
        auVar76 = vxorps_avx512vl(auVar71,auVar71);
        auVar185 = ZEXT1664(auVar76);
        auVar93 = vfmadd213ps_avx512vl(auVar89,auVar89,ZEXT1632(auVar76));
        auVar71 = vfmadd231ps_fma(auVar93,auVar95,auVar95);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar71));
        fVar140 = auVar92._0_4_;
        fVar129 = auVar92._4_4_;
        fVar130 = auVar92._8_4_;
        fVar131 = auVar92._12_4_;
        fVar157 = auVar92._16_4_;
        fVar161 = auVar92._20_4_;
        fVar67 = auVar92._24_4_;
        auVar93._4_4_ = fVar129 * fVar129 * fVar129 * auVar71._4_4_ * -0.5;
        auVar93._0_4_ = fVar140 * fVar140 * fVar140 * auVar71._0_4_ * -0.5;
        auVar93._8_4_ = fVar130 * fVar130 * fVar130 * auVar71._8_4_ * -0.5;
        auVar93._12_4_ = fVar131 * fVar131 * fVar131 * auVar71._12_4_ * -0.5;
        auVar93._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar93._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar93._24_4_ = fVar67 * fVar67 * fVar67 * -0.0;
        auVar93._28_4_ = 0;
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar77,auVar92);
        auVar94._4_4_ = auVar95._4_4_ * auVar93._4_4_;
        auVar94._0_4_ = auVar95._0_4_ * auVar93._0_4_;
        auVar94._8_4_ = auVar95._8_4_ * auVar93._8_4_;
        auVar94._12_4_ = auVar95._12_4_ * auVar93._12_4_;
        auVar94._16_4_ = auVar95._16_4_ * auVar93._16_4_;
        auVar94._20_4_ = auVar95._20_4_ * auVar93._20_4_;
        auVar94._24_4_ = auVar95._24_4_ * auVar93._24_4_;
        auVar94._28_4_ = auVar92._28_4_;
        auVar92._4_4_ = auVar93._4_4_ * -auVar89._4_4_;
        auVar92._0_4_ = auVar93._0_4_ * -auVar89._0_4_;
        auVar92._8_4_ = auVar93._8_4_ * -auVar89._8_4_;
        auVar92._12_4_ = auVar93._12_4_ * -auVar89._12_4_;
        auVar92._16_4_ = auVar93._16_4_ * -auVar89._16_4_;
        auVar92._20_4_ = auVar93._20_4_ * -auVar89._20_4_;
        auVar92._24_4_ = auVar93._24_4_ * -auVar89._24_4_;
        auVar92._28_4_ = auVar89._28_4_ ^ 0x80000000;
        auVar85 = vmulps_avx512vl(auVar93,ZEXT1632(auVar76));
        auVar88 = ZEXT1632(auVar76);
        auVar91 = vfmadd213ps_avx512vl(auVar96,auVar96,auVar88);
        auVar71 = vfmadd231ps_fma(auVar91,auVar84,auVar84);
        auVar79 = vrsqrt14ps_avx512vl(ZEXT1632(auVar71));
        fVar140 = auVar79._0_4_;
        fVar129 = auVar79._4_4_;
        fVar130 = auVar79._8_4_;
        fVar131 = auVar79._12_4_;
        fVar157 = auVar79._16_4_;
        fVar161 = auVar79._20_4_;
        fVar67 = auVar79._24_4_;
        auVar91._4_4_ = fVar129 * fVar129 * fVar129 * auVar71._4_4_ * -0.5;
        auVar91._0_4_ = fVar140 * fVar140 * fVar140 * auVar71._0_4_ * -0.5;
        auVar91._8_4_ = fVar130 * fVar130 * fVar130 * auVar71._8_4_ * -0.5;
        auVar91._12_4_ = fVar131 * fVar131 * fVar131 * auVar71._12_4_ * -0.5;
        auVar91._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar91._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar91._24_4_ = fVar67 * fVar67 * fVar67 * -0.0;
        auVar91._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar77,auVar79);
        auVar78._4_4_ = auVar84._4_4_ * auVar91._4_4_;
        auVar78._0_4_ = auVar84._0_4_ * auVar91._0_4_;
        auVar78._8_4_ = auVar84._8_4_ * auVar91._8_4_;
        auVar78._12_4_ = auVar84._12_4_ * auVar91._12_4_;
        auVar78._16_4_ = auVar84._16_4_ * auVar91._16_4_;
        auVar78._20_4_ = auVar84._20_4_ * auVar91._20_4_;
        auVar78._24_4_ = auVar84._24_4_ * auVar91._24_4_;
        auVar78._28_4_ = auVar79._28_4_;
        auVar79._4_4_ = -auVar96._4_4_ * auVar91._4_4_;
        auVar79._0_4_ = -auVar96._0_4_ * auVar91._0_4_;
        auVar79._8_4_ = -auVar96._8_4_ * auVar91._8_4_;
        auVar79._12_4_ = -auVar96._12_4_ * auVar91._12_4_;
        auVar79._16_4_ = -auVar96._16_4_ * auVar91._16_4_;
        auVar79._20_4_ = -auVar96._20_4_ * auVar91._20_4_;
        auVar79._24_4_ = -auVar96._24_4_ * auVar91._24_4_;
        auVar79._28_4_ = auVar93._28_4_;
        auVar93 = vmulps_avx512vl(auVar91,auVar88);
        auVar71 = vfmadd213ps_fma(auVar94,auVar87,auVar80);
        auVar184 = vfmadd213ps_fma(auVar92,auVar87,auVar81);
        auVar91 = vfmadd213ps_avx512vl(auVar85,auVar87,auVar86);
        auVar77 = vfmadd213ps_avx512vl(auVar78,ZEXT1632(auVar18),auVar82);
        auVar75 = vfnmadd213ps_fma(auVar94,auVar87,auVar80);
        auVar80 = ZEXT1632(auVar18);
        auVar74 = vfmadd213ps_fma(auVar79,auVar80,auVar83);
        auVar22 = vfnmadd213ps_fma(auVar92,auVar87,auVar81);
        auVar19 = vfmadd213ps_fma(auVar93,auVar80,auVar90);
        auVar94 = vfnmadd231ps_avx512vl(auVar86,auVar87,auVar85);
        auVar72 = vfnmadd213ps_fma(auVar78,auVar80,auVar82);
        auVar70 = vfnmadd213ps_fma(auVar79,auVar80,auVar83);
        auVar69 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar18),auVar93);
        auVar92 = vsubps_avx512vl(auVar77,ZEXT1632(auVar75));
        auVar93 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar22));
        auVar78 = vsubps_avx512vl(ZEXT1632(auVar19),auVar94);
        auVar79 = vmulps_avx512vl(auVar93,auVar94);
        auVar20 = vfmsub231ps_fma(auVar79,ZEXT1632(auVar22),auVar78);
        auVar90._4_4_ = auVar75._4_4_ * auVar78._4_4_;
        auVar90._0_4_ = auVar75._0_4_ * auVar78._0_4_;
        auVar90._8_4_ = auVar75._8_4_ * auVar78._8_4_;
        auVar90._12_4_ = auVar75._12_4_ * auVar78._12_4_;
        auVar90._16_4_ = auVar78._16_4_ * 0.0;
        auVar90._20_4_ = auVar78._20_4_ * 0.0;
        auVar90._24_4_ = auVar78._24_4_ * 0.0;
        auVar90._28_4_ = auVar78._28_4_;
        auVar78 = vfmsub231ps_avx512vl(auVar90,auVar94,auVar92);
        auVar80._4_4_ = auVar22._4_4_ * auVar92._4_4_;
        auVar80._0_4_ = auVar22._0_4_ * auVar92._0_4_;
        auVar80._8_4_ = auVar22._8_4_ * auVar92._8_4_;
        auVar80._12_4_ = auVar22._12_4_ * auVar92._12_4_;
        auVar80._16_4_ = auVar92._16_4_ * 0.0;
        auVar80._20_4_ = auVar92._20_4_ * 0.0;
        auVar80._24_4_ = auVar92._24_4_ * 0.0;
        auVar80._28_4_ = auVar92._28_4_;
        auVar21 = vfmsub231ps_fma(auVar80,ZEXT1632(auVar75),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar88,auVar78);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar20));
        auVar84 = ZEXT1632(auVar76);
        uVar66 = vcmpps_avx512vl(auVar93,auVar84,2);
        bVar59 = (byte)uVar66;
        fVar67 = (float)((uint)(bVar59 & 1) * auVar71._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar72._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        fVar113 = (float)((uint)bVar61 * auVar71._4_4_ | (uint)!bVar61 * auVar72._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        fVar115 = (float)((uint)bVar61 * auVar71._8_4_ | (uint)!bVar61 * auVar72._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        fVar118 = (float)((uint)bVar61 * auVar71._12_4_ | (uint)!bVar61 * auVar72._12_4_);
        auVar79 = ZEXT1632(CONCAT412(fVar118,CONCAT48(fVar115,CONCAT44(fVar113,fVar67))));
        fVar68 = (float)((uint)(bVar59 & 1) * auVar184._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar70._0_4_);
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        fVar114 = (float)((uint)bVar61 * auVar184._4_4_ | (uint)!bVar61 * auVar70._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        fVar116 = (float)((uint)bVar61 * auVar184._8_4_ | (uint)!bVar61 * auVar70._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        fVar119 = (float)((uint)bVar61 * auVar184._12_4_ | (uint)!bVar61 * auVar70._12_4_);
        auVar90 = ZEXT1632(CONCAT412(fVar119,CONCAT48(fVar116,CONCAT44(fVar114,fVar68))));
        auVar85._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar69._0_4_)
        ;
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar85._4_4_ = (float)((uint)bVar61 * auVar91._4_4_ | (uint)!bVar61 * auVar69._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar85._8_4_ = (float)((uint)bVar61 * auVar91._8_4_ | (uint)!bVar61 * auVar69._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar85._12_4_ = (float)((uint)bVar61 * auVar91._12_4_ | (uint)!bVar61 * auVar69._12_4_);
        fVar140 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar91._16_4_);
        auVar85._16_4_ = fVar140;
        fVar129 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar91._20_4_);
        auVar85._20_4_ = fVar129;
        fVar130 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar91._24_4_);
        auVar85._24_4_ = fVar130;
        iVar1 = (uint)(byte)(uVar66 >> 7) * auVar91._28_4_;
        auVar85._28_4_ = iVar1;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar77);
        auVar97._0_4_ =
             (uint)(bVar59 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar20._0_4_;
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar97._4_4_ = (uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar20._4_4_;
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar97._8_4_ = (uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar20._8_4_;
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar97._12_4_ = (uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar20._12_4_;
        auVar97._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar92._16_4_;
        auVar97._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar92._20_4_;
        auVar97._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar92._24_4_;
        auVar97._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar74));
        auVar98._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar184._0_4_
                    );
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar184._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar184._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar184._12_4_);
        fVar131 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar92._16_4_);
        auVar98._16_4_ = fVar131;
        fVar157 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar92._20_4_);
        auVar98._20_4_ = fVar157;
        fVar161 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar92._24_4_);
        auVar98._24_4_ = fVar161;
        auVar98._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar19));
        auVar99._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar91._0_4_)
        ;
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar91._4_4_);
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar91._8_4_);
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar91._12_4_);
        bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar61 * auVar92._16_4_ | (uint)!bVar61 * auVar91._16_4_);
        bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar61 * auVar92._20_4_ | (uint)!bVar61 * auVar91._20_4_);
        bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar61 * auVar92._24_4_ | (uint)!bVar61 * auVar91._24_4_);
        bVar61 = SUB81(uVar66 >> 7,0);
        auVar99._28_4_ = (uint)bVar61 * auVar92._28_4_ | (uint)!bVar61 * auVar91._28_4_;
        auVar100._0_4_ =
             (uint)(bVar59 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar77._0_4_;
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar100._4_4_ = (uint)bVar61 * (int)auVar75._4_4_ | (uint)!bVar61 * auVar77._4_4_;
        bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar100._8_4_ = (uint)bVar61 * (int)auVar75._8_4_ | (uint)!bVar61 * auVar77._8_4_;
        bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar100._12_4_ = (uint)bVar61 * (int)auVar75._12_4_ | (uint)!bVar61 * auVar77._12_4_;
        auVar100._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar77._16_4_;
        auVar100._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar77._20_4_;
        auVar100._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar77._24_4_;
        auVar100._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar77._28_4_;
        bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar101._0_4_ =
             (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar101._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar94._16_4_;
        auVar101._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar94._20_4_;
        auVar101._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar66 >> 7) * auVar94._28_4_;
        auVar101._28_4_ = iVar2;
        auVar80 = vsubps_avx512vl(auVar100,auVar79);
        auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar22._12_4_ |
                                                (uint)!bVar15 * auVar74._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar22._8_4_ |
                                                         (uint)!bVar13 * auVar74._8_4_,
                                                         CONCAT44((uint)bVar61 * (int)auVar22._4_4_
                                                                  | (uint)!bVar61 * auVar74._4_4_,
                                                                  (uint)(bVar59 & 1) *
                                                                  (int)auVar22._0_4_ |
                                                                  (uint)!(bool)(bVar59 & 1) *
                                                                  auVar74._0_4_)))),auVar90);
        auVar92 = vsubps_avx(auVar101,auVar85);
        auVar91 = vsubps_avx(auVar79,auVar97);
        auVar77 = vsubps_avx(auVar90,auVar98);
        auVar78 = vsubps_avx(auVar85,auVar99);
        auVar81._4_4_ = auVar92._4_4_ * fVar113;
        auVar81._0_4_ = auVar92._0_4_ * fVar67;
        auVar81._8_4_ = auVar92._8_4_ * fVar115;
        auVar81._12_4_ = auVar92._12_4_ * fVar118;
        auVar81._16_4_ = auVar92._16_4_ * 0.0;
        auVar81._20_4_ = auVar92._20_4_ * 0.0;
        auVar81._24_4_ = auVar92._24_4_ * 0.0;
        auVar81._28_4_ = iVar2;
        auVar71 = vfmsub231ps_fma(auVar81,auVar85,auVar80);
        auVar82._4_4_ = fVar114 * auVar80._4_4_;
        auVar82._0_4_ = fVar68 * auVar80._0_4_;
        auVar82._8_4_ = fVar116 * auVar80._8_4_;
        auVar82._12_4_ = fVar119 * auVar80._12_4_;
        auVar82._16_4_ = auVar80._16_4_ * 0.0;
        auVar82._20_4_ = auVar80._20_4_ * 0.0;
        auVar82._24_4_ = auVar80._24_4_ * 0.0;
        auVar82._28_4_ = auVar93._28_4_;
        auVar184 = vfmsub231ps_fma(auVar82,auVar79,auVar94);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar84,ZEXT1632(auVar71));
        auVar150._0_4_ = auVar94._0_4_ * auVar85._0_4_;
        auVar150._4_4_ = auVar94._4_4_ * auVar85._4_4_;
        auVar150._8_4_ = auVar94._8_4_ * auVar85._8_4_;
        auVar150._12_4_ = auVar94._12_4_ * auVar85._12_4_;
        auVar150._16_4_ = auVar94._16_4_ * fVar140;
        auVar150._20_4_ = auVar94._20_4_ * fVar129;
        auVar150._24_4_ = auVar94._24_4_ * fVar130;
        auVar150._28_4_ = 0;
        auVar71 = vfmsub231ps_fma(auVar150,auVar90,auVar92);
        auVar81 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar71));
        auVar93 = vmulps_avx512vl(auVar78,auVar97);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar99);
        auVar83._4_4_ = auVar77._4_4_ * auVar99._4_4_;
        auVar83._0_4_ = auVar77._0_4_ * auVar99._0_4_;
        auVar83._8_4_ = auVar77._8_4_ * auVar99._8_4_;
        auVar83._12_4_ = auVar77._12_4_ * auVar99._12_4_;
        auVar83._16_4_ = auVar77._16_4_ * auVar99._16_4_;
        auVar83._20_4_ = auVar77._20_4_ * auVar99._20_4_;
        auVar83._24_4_ = auVar77._24_4_ * auVar99._24_4_;
        auVar83._28_4_ = auVar99._28_4_;
        auVar71 = vfmsub231ps_fma(auVar83,auVar98,auVar78);
        auVar151._0_4_ = auVar98._0_4_ * auVar91._0_4_;
        auVar151._4_4_ = auVar98._4_4_ * auVar91._4_4_;
        auVar151._8_4_ = auVar98._8_4_ * auVar91._8_4_;
        auVar151._12_4_ = auVar98._12_4_ * auVar91._12_4_;
        auVar151._16_4_ = fVar131 * auVar91._16_4_;
        auVar151._20_4_ = fVar157 * auVar91._20_4_;
        auVar151._24_4_ = fVar161 * auVar91._24_4_;
        auVar151._28_4_ = 0;
        auVar184 = vfmsub231ps_fma(auVar151,auVar77,auVar97);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar84,auVar93);
        auVar82 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar71));
        auVar93 = vmaxps_avx(auVar81,auVar82);
        uVar132 = vcmpps_avx512vl(auVar93,auVar84,2);
        bVar65 = bVar65 & (byte)uVar132;
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar181 = ZEXT3264(auVar83);
        auVar182 = ZEXT3264(local_400);
        auVar183 = ZEXT3264(local_3e0);
        auVar179 = ZEXT3264(local_560);
        if (bVar65 == 0) {
          bVar61 = false;
          auVar186 = ZEXT3264(local_4c0);
          auVar188 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
        }
        else {
          uVar122 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar173._4_4_ = uVar122;
          auVar173._0_4_ = uVar122;
          auVar173._8_4_ = uVar122;
          auVar173._12_4_ = uVar122;
          auVar173._16_4_ = uVar122;
          auVar173._20_4_ = uVar122;
          auVar173._24_4_ = uVar122;
          auVar173._28_4_ = uVar122;
          auVar175 = ZEXT3264(auVar173);
          auVar30._4_4_ = auVar78._4_4_ * auVar94._4_4_;
          auVar30._0_4_ = auVar78._0_4_ * auVar94._0_4_;
          auVar30._8_4_ = auVar78._8_4_ * auVar94._8_4_;
          auVar30._12_4_ = auVar78._12_4_ * auVar94._12_4_;
          auVar30._16_4_ = auVar78._16_4_ * auVar94._16_4_;
          auVar30._20_4_ = auVar78._20_4_ * auVar94._20_4_;
          auVar30._24_4_ = auVar78._24_4_ * auVar94._24_4_;
          auVar30._28_4_ = auVar93._28_4_;
          auVar74 = vfmsub231ps_fma(auVar30,auVar77,auVar92);
          auVar31._4_4_ = auVar92._4_4_ * auVar91._4_4_;
          auVar31._0_4_ = auVar92._0_4_ * auVar91._0_4_;
          auVar31._8_4_ = auVar92._8_4_ * auVar91._8_4_;
          auVar31._12_4_ = auVar92._12_4_ * auVar91._12_4_;
          auVar31._16_4_ = auVar92._16_4_ * auVar91._16_4_;
          auVar31._20_4_ = auVar92._20_4_ * auVar91._20_4_;
          auVar31._24_4_ = auVar92._24_4_ * auVar91._24_4_;
          auVar31._28_4_ = auVar92._28_4_;
          auVar184 = vfmsub231ps_fma(auVar31,auVar80,auVar78);
          auVar32._4_4_ = auVar77._4_4_ * auVar80._4_4_;
          auVar32._0_4_ = auVar77._0_4_ * auVar80._0_4_;
          auVar32._8_4_ = auVar77._8_4_ * auVar80._8_4_;
          auVar32._12_4_ = auVar77._12_4_ * auVar80._12_4_;
          auVar32._16_4_ = auVar77._16_4_ * auVar80._16_4_;
          auVar32._20_4_ = auVar77._20_4_ * auVar80._20_4_;
          auVar32._24_4_ = auVar77._24_4_ * auVar80._24_4_;
          auVar32._28_4_ = auVar77._28_4_;
          auVar19 = vfmsub231ps_fma(auVar32,auVar91,auVar94);
          auVar71 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar184),ZEXT1632(auVar19));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar74),auVar84);
          auVar94 = vrcp14ps_avx512vl(auVar93);
          auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar83);
          auVar71 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
          auVar33._4_4_ = auVar19._4_4_ * auVar85._4_4_;
          auVar33._0_4_ = auVar19._0_4_ * auVar85._0_4_;
          auVar33._8_4_ = auVar19._8_4_ * auVar85._8_4_;
          auVar33._12_4_ = auVar19._12_4_ * auVar85._12_4_;
          auVar33._16_4_ = fVar140 * 0.0;
          auVar33._20_4_ = fVar129 * 0.0;
          auVar33._24_4_ = fVar130 * 0.0;
          auVar33._28_4_ = iVar1;
          auVar184 = vfmadd231ps_fma(auVar33,auVar90,ZEXT1632(auVar184));
          auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar79,ZEXT1632(auVar74));
          fVar140 = auVar71._0_4_;
          fVar129 = auVar71._4_4_;
          fVar130 = auVar71._8_4_;
          fVar131 = auVar71._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar184._12_4_ * fVar131,
                                         CONCAT48(auVar184._8_4_ * fVar130,
                                                  CONCAT44(auVar184._4_4_ * fVar129,
                                                           auVar184._0_4_ * fVar140))));
          auVar164._4_4_ = uVar63;
          auVar164._0_4_ = uVar63;
          auVar164._8_4_ = uVar63;
          auVar164._12_4_ = uVar63;
          auVar164._16_4_ = uVar63;
          auVar164._20_4_ = uVar63;
          auVar164._24_4_ = uVar63;
          auVar164._28_4_ = uVar63;
          uVar132 = vcmpps_avx512vl(local_240,auVar173,2);
          uVar23 = vcmpps_avx512vl(auVar164,local_240,2);
          bVar65 = (byte)uVar132 & (byte)uVar23 & bVar65;
          auVar186 = ZEXT3264(local_4c0);
          auVar188 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
          if (bVar65 != 0) {
            uVar132 = vcmpps_avx512vl(auVar93,auVar84,4);
            bVar65 = bVar65 & (byte)uVar132;
            auVar165 = ZEXT1664(local_5e0);
            if (bVar65 != 0) {
              fVar157 = auVar81._0_4_ * fVar140;
              fVar161 = auVar81._4_4_ * fVar129;
              auVar34._4_4_ = fVar161;
              auVar34._0_4_ = fVar157;
              fVar67 = auVar81._8_4_ * fVar130;
              auVar34._8_4_ = fVar67;
              fVar68 = auVar81._12_4_ * fVar131;
              auVar34._12_4_ = fVar68;
              fVar113 = auVar81._16_4_ * 0.0;
              auVar34._16_4_ = fVar113;
              fVar114 = auVar81._20_4_ * 0.0;
              auVar34._20_4_ = fVar114;
              fVar115 = auVar81._24_4_ * 0.0;
              auVar34._24_4_ = fVar115;
              auVar34._28_4_ = auVar93._28_4_;
              auVar94 = vsubps_avx512vl(auVar83,auVar34);
              local_280._0_4_ =
                   (float)((uint)(bVar59 & 1) * (int)fVar157 |
                          (uint)!(bool)(bVar59 & 1) * auVar94._0_4_);
              bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
              local_280._4_4_ = (float)((uint)bVar61 * (int)fVar161 | (uint)!bVar61 * auVar94._4_4_)
              ;
              bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
              local_280._8_4_ = (float)((uint)bVar61 * (int)fVar67 | (uint)!bVar61 * auVar94._8_4_);
              bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
              local_280._12_4_ =
                   (float)((uint)bVar61 * (int)fVar68 | (uint)!bVar61 * auVar94._12_4_);
              bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
              local_280._16_4_ =
                   (float)((uint)bVar61 * (int)fVar113 | (uint)!bVar61 * auVar94._16_4_);
              bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
              local_280._20_4_ =
                   (float)((uint)bVar61 * (int)fVar114 | (uint)!bVar61 * auVar94._20_4_);
              bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
              local_280._24_4_ =
                   (float)((uint)bVar61 * (int)fVar115 | (uint)!bVar61 * auVar94._24_4_);
              bVar61 = SUB81(uVar66 >> 7,0);
              local_280._28_4_ =
                   (float)((uint)bVar61 * auVar93._28_4_ | (uint)!bVar61 * auVar94._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar18),auVar87);
              auVar71 = vfmadd213ps_fma(auVar93,local_280,auVar87);
              uVar122 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar87._4_4_ = uVar122;
              auVar87._0_4_ = uVar122;
              auVar87._8_4_ = uVar122;
              auVar87._12_4_ = uVar122;
              auVar87._16_4_ = uVar122;
              auVar87._20_4_ = uVar122;
              auVar87._24_4_ = uVar122;
              auVar87._28_4_ = uVar122;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar71._12_4_ + auVar71._12_4_,
                                                           CONCAT48(auVar71._8_4_ + auVar71._8_4_,
                                                                    CONCAT44(auVar71._4_4_ +
                                                                             auVar71._4_4_,
                                                                             auVar71._0_4_ +
                                                                             auVar71._0_4_)))),
                                        auVar87);
              uVar132 = vcmpps_avx512vl(local_240,auVar93,6);
              if (((byte)uVar132 & bVar65) != 0) {
                auVar139._0_4_ = auVar82._0_4_ * fVar140;
                auVar139._4_4_ = auVar82._4_4_ * fVar129;
                auVar139._8_4_ = auVar82._8_4_ * fVar130;
                auVar139._12_4_ = auVar82._12_4_ * fVar131;
                auVar139._16_4_ = auVar82._16_4_ * 0.0;
                auVar139._20_4_ = auVar82._20_4_ * 0.0;
                auVar139._24_4_ = auVar82._24_4_ * 0.0;
                auVar139._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar83,auVar139);
                auVar102._0_4_ =
                     (uint)(bVar59 & 1) * (int)auVar139._0_4_ |
                     (uint)!(bool)(bVar59 & 1) * auVar93._0_4_;
                bVar61 = (bool)((byte)(uVar66 >> 1) & 1);
                auVar102._4_4_ = (uint)bVar61 * (int)auVar139._4_4_ | (uint)!bVar61 * auVar93._4_4_;
                bVar61 = (bool)((byte)(uVar66 >> 2) & 1);
                auVar102._8_4_ = (uint)bVar61 * (int)auVar139._8_4_ | (uint)!bVar61 * auVar93._8_4_;
                bVar61 = (bool)((byte)(uVar66 >> 3) & 1);
                auVar102._12_4_ =
                     (uint)bVar61 * (int)auVar139._12_4_ | (uint)!bVar61 * auVar93._12_4_;
                bVar61 = (bool)((byte)(uVar66 >> 4) & 1);
                auVar102._16_4_ =
                     (uint)bVar61 * (int)auVar139._16_4_ | (uint)!bVar61 * auVar93._16_4_;
                bVar61 = (bool)((byte)(uVar66 >> 5) & 1);
                auVar102._20_4_ =
                     (uint)bVar61 * (int)auVar139._20_4_ | (uint)!bVar61 * auVar93._20_4_;
                bVar61 = (bool)((byte)(uVar66 >> 6) & 1);
                auVar102._24_4_ =
                     (uint)bVar61 * (int)auVar139._24_4_ | (uint)!bVar61 * auVar93._24_4_;
                auVar102._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar93._28_4_;
                auVar27._8_4_ = 0x40000000;
                auVar27._0_8_ = 0x4000000040000000;
                auVar27._12_4_ = 0x40000000;
                auVar27._16_4_ = 0x40000000;
                auVar27._20_4_ = 0x40000000;
                auVar27._24_4_ = 0x40000000;
                auVar27._28_4_ = 0x40000000;
                local_260 = vfmsub132ps_avx512vl(auVar102,auVar83,auVar27);
                local_220 = 0;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar61 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar140 = 1.0 / (float)local_540._0_4_;
                    local_1c0[0] = fVar140 * (local_280._0_4_ + 0.0);
                    local_1c0[1] = fVar140 * (local_280._4_4_ + 1.0);
                    local_1c0[2] = fVar140 * (local_280._8_4_ + 2.0);
                    local_1c0[3] = fVar140 * (local_280._12_4_ + 3.0);
                    fStack_1b0 = fVar140 * (local_280._16_4_ + 4.0);
                    fStack_1ac = fVar140 * (local_280._20_4_ + 5.0);
                    fStack_1a8 = fVar140 * (local_280._24_4_ + 6.0);
                    fStack_1a4 = local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    local_2c0 = 0;
                    uVar60 = (ulong)((byte)uVar132 & bVar65);
                    for (uVar66 = uVar60; (uVar66 & 1) == 0;
                        uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                      local_2c0 = local_2c0 + 1;
                    }
                    local_5a0 = vpbroadcastd_avx512vl();
                    local_5b0 = vpbroadcastd_avx512vl();
                    local_460 = auVar173;
                    local_21c = iVar9;
                    local_210 = local_5e0;
                    local_200 = local_5c0;
                    uStack_1f8 = uStack_5b8;
                    local_1f0 = local_5d0;
                    uStack_1e8 = uStack_5c8;
                    do {
                      auVar184 = auVar185._0_16_;
                      local_380 = (uint)uVar60;
                      uStack_37c = (uint)(uVar60 >> 0x20);
                      local_320 = local_1c0[local_2c0];
                      local_310 = *(undefined4 *)(local_1a0 + local_2c0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_180 + local_2c0 * 4);
                      local_590.context = context->user;
                      fVar129 = 1.0 - local_320;
                      fVar140 = fVar129 * fVar129 * -3.0;
                      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),
                                                ZEXT416((uint)(local_320 * fVar129)),
                                                ZEXT416(0xc0000000));
                      auVar71 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar129)),
                                                ZEXT416((uint)(local_320 * local_320)),
                                                ZEXT416(0x40000000));
                      fVar129 = auVar73._0_4_ * 3.0;
                      fVar130 = auVar71._0_4_ * 3.0;
                      fVar131 = local_320 * local_320 * 3.0;
                      auVar155._0_4_ = fVar131 * local_480;
                      auVar155._4_4_ = fVar131 * fStack_47c;
                      auVar155._8_4_ = fVar131 * fStack_478;
                      auVar155._12_4_ = fVar131 * fStack_474;
                      auVar125._4_4_ = fVar130;
                      auVar125._0_4_ = fVar130;
                      auVar125._8_4_ = fVar130;
                      auVar125._12_4_ = fVar130;
                      auVar53._8_8_ = uStack_5c8;
                      auVar53._0_8_ = local_5d0;
                      auVar73 = vfmadd132ps_fma(auVar125,auVar155,auVar53);
                      auVar145._4_4_ = fVar129;
                      auVar145._0_4_ = fVar129;
                      auVar145._8_4_ = fVar129;
                      auVar145._12_4_ = fVar129;
                      auVar55._8_8_ = uStack_5b8;
                      auVar55._0_8_ = local_5c0;
                      auVar73 = vfmadd132ps_fma(auVar145,auVar73,auVar55);
                      auVar126._4_4_ = fVar140;
                      auVar126._0_4_ = fVar140;
                      auVar126._8_4_ = fVar140;
                      auVar126._12_4_ = fVar140;
                      auVar73 = vfmadd213ps_fma(auVar126,auVar165._0_16_,auVar73);
                      local_350 = auVar73._0_4_;
                      local_340 = vshufps_avx(auVar73,auVar73,0x55);
                      local_330 = vshufps_avx(auVar73,auVar73,0xaa);
                      local_300 = local_5b0._0_8_;
                      uStack_2f8 = local_5b0._8_8_;
                      local_2f0 = local_5a0;
                      vpcmpeqd_avx2(ZEXT1632(local_5a0),ZEXT1632(local_5a0));
                      uStack_2dc = (local_590.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_590.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_600 = local_390;
                      local_590.valid = (int *)local_600;
                      local_590.geometryUserPtr = pGVar10->userPtr;
                      local_590.hit = (RTCHitN *)&local_350;
                      local_590.N = 4;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      fStack_31c = local_320;
                      fStack_318 = local_320;
                      fStack_314 = local_320;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_590);
                        auVar175 = ZEXT3264(local_460);
                        auVar190 = ZEXT1664(local_3c0._0_16_);
                        auVar189 = ZEXT3264(local_500);
                        auVar188 = ZEXT3264(local_4e0);
                        auVar187 = ZEXT3264(local_420);
                        auVar186 = ZEXT3264(local_4c0);
                        auVar180 = ZEXT3264(local_520);
                        auVar179 = ZEXT3264(local_560);
                        auVar183 = ZEXT3264(local_3e0);
                        auVar182 = ZEXT3264(local_400);
                        auVar165 = ZEXT1664(local_5e0);
                        auVar73 = vxorps_avx512vl(auVar184,auVar184);
                        auVar185 = ZEXT1664(auVar73);
                        uVar63 = local_440._0_4_;
                      }
                      auVar73 = auVar185._0_16_;
                      uVar66 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar66 & 0xf) == 0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar181 = ZEXT3264(auVar93);
                        uVar60 = CONCAT44(uStack_37c,local_380);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar181 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar181 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_590);
                            auVar175 = ZEXT3264(local_460);
                            auVar190 = ZEXT1664(local_3c0._0_16_);
                            auVar189 = ZEXT3264(local_500);
                            auVar188 = ZEXT3264(local_4e0);
                            auVar187 = ZEXT3264(local_420);
                            auVar186 = ZEXT3264(local_4c0);
                            auVar180 = ZEXT3264(local_520);
                            auVar179 = ZEXT3264(local_560);
                            auVar183 = ZEXT3264(local_3e0);
                            auVar182 = ZEXT3264(local_400);
                            auVar165 = ZEXT1664(local_5e0);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar181 = ZEXT3264(auVar93);
                            auVar73 = vxorps_avx512vl(auVar73,auVar73);
                            auVar185 = ZEXT1664(auVar73);
                            uVar63 = local_440._0_4_;
                          }
                        }
                        auVar73 = auVar190._0_16_;
                        uVar66 = vptestmd_avx512vl(local_600,local_600);
                        uVar66 = uVar66 & 0xf;
                        auVar71 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar61 = (bool)((byte)uVar66 & 1);
                        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
                        bVar15 = SUB81(uVar66 >> 3,0);
                        *(uint *)(local_590.ray + 0x80) =
                             (uint)bVar61 * auVar71._0_4_ |
                             (uint)!bVar61 * *(int *)(local_590.ray + 0x80);
                        *(uint *)(local_590.ray + 0x84) =
                             (uint)bVar12 * auVar71._4_4_ |
                             (uint)!bVar12 * *(int *)(local_590.ray + 0x84);
                        *(uint *)(local_590.ray + 0x88) =
                             (uint)bVar13 * auVar71._8_4_ |
                             (uint)!bVar13 * *(int *)(local_590.ray + 0x88);
                        *(uint *)(local_590.ray + 0x8c) =
                             (uint)bVar15 * auVar71._12_4_ |
                             (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                        uVar60 = CONCAT44(uStack_37c,local_380);
                        if ((byte)uVar66 != 0) {
                          bVar61 = true;
                          break;
                        }
                      }
                      auVar73 = auVar190._0_16_;
                      *(int *)(ray + k * 4 + 0x80) = auVar175._0_4_;
                      uVar66 = local_2c0 & 0x3f;
                      bVar61 = false;
                      local_2c0 = 0;
                      uVar60 = uVar60 ^ 1L << uVar66;
                      for (uVar66 = uVar60; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                        local_2c0 = local_2c0 + 1;
                      }
                    } while (uVar60 != 0);
                  }
                  goto LAB_01b09042;
                }
              }
            }
          }
          bVar61 = false;
        }
      }
LAB_01b09042:
      if (8 < iVar9) {
        local_3c0 = vpbroadcastd_avx512vl();
        local_440 = vbroadcastss_avx512vl(auVar73);
        fStack_2b8 = 1.0 / (float)local_540._0_4_;
        local_540 = vpbroadcastd_avx512vl();
        local_530 = vpbroadcastd_avx512vl();
        lVar62 = 8;
        local_520 = auVar180._0_32_;
        local_380 = uVar63;
        uStack_37c = uVar63;
        uStack_378 = uVar63;
        uStack_374 = uVar63;
        uStack_370 = uVar63;
        uStack_36c = uVar63;
        uStack_368 = uVar63;
        uStack_364 = uVar63;
        fStack_2b4 = fStack_2b8;
        fStack_2b0 = fStack_2b8;
        fStack_2ac = fStack_2b8;
        fStack_2a8 = fStack_2b8;
        fStack_2a4 = fStack_2b8;
        local_2c0._0_4_ = fStack_2b8;
        local_2c0._4_4_ = fStack_2b8;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar77 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar77,local_3c0,1);
          auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 * 4 + lVar24);
          auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21aa768 + lVar62 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21aabec + lVar62 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21ab070 + lVar62 * 4);
          local_4e0 = auVar188._0_32_;
          auVar78 = vmulps_avx512vl(local_4e0,auVar91);
          local_500 = auVar189._0_32_;
          auVar79 = vmulps_avx512vl(local_500,auVar91);
          auVar35._4_4_ = auVar91._4_4_ * (float)local_e0._4_4_;
          auVar35._0_4_ = auVar91._0_4_ * (float)local_e0._0_4_;
          auVar35._8_4_ = auVar91._8_4_ * fStack_d8;
          auVar35._12_4_ = auVar91._12_4_ * fStack_d4;
          auVar35._16_4_ = auVar91._16_4_ * fStack_d0;
          auVar35._20_4_ = auVar91._20_4_ * fStack_cc;
          auVar35._24_4_ = auVar91._24_4_ * fStack_c8;
          auVar35._28_4_ = auVar77._28_4_;
          local_4c0 = auVar186._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar78,auVar92,local_4c0);
          auVar97 = auVar187._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar79,auVar92,auVar97);
          auVar79 = vfmadd231ps_avx512vl(auVar35,auVar92,local_c0);
          auVar89 = auVar179._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar77,auVar94,auVar89);
          auVar95 = auVar180._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar94,auVar95);
          auVar73 = vfmadd231ps_fma(auVar79,auVar94,local_a0);
          auVar96 = auVar182._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar77,auVar93,auVar96);
          local_3e0 = auVar183._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar78,auVar93,local_3e0);
          auVar77 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 * 4 + lVar24);
          auVar78 = *(undefined1 (*) [32])(lVar24 + 0x21acb88 + lVar62 * 4);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar93,local_80);
          auVar79 = *(undefined1 (*) [32])(lVar24 + 0x21ad00c + lVar62 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21ad490 + lVar62 * 4);
          auVar80 = vmulps_avx512vl(local_4e0,auVar90);
          auVar81 = vmulps_avx512vl(local_500,auVar90);
          auVar36._4_4_ = auVar90._4_4_ * (float)local_e0._4_4_;
          auVar36._0_4_ = auVar90._0_4_ * (float)local_e0._0_4_;
          auVar36._8_4_ = auVar90._8_4_ * fStack_d8;
          auVar36._12_4_ = auVar90._12_4_ * fStack_d4;
          auVar36._16_4_ = auVar90._16_4_ * fStack_d0;
          auVar36._20_4_ = auVar90._20_4_ * fStack_cc;
          auVar36._24_4_ = auVar90._24_4_ * fStack_c8;
          auVar36._28_4_ = uStack_c4;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar79,local_4c0);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar97);
          auVar84 = vfmadd231ps_avx512vl(auVar36,auVar79,local_c0);
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar89);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar95);
          auVar71 = vfmadd231ps_fma(auVar84,auVar78,local_a0);
          auVar84 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar96);
          auVar85 = vfmadd231ps_avx512vl(auVar81,auVar77,local_3e0);
          auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar77,local_80);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar71));
          auVar80 = vsubps_avx(auVar84,auVar82);
          auVar81 = vsubps_avx(auVar85,auVar83);
          auVar87 = vmulps_avx512vl(auVar83,auVar80);
          auVar88 = vmulps_avx512vl(auVar82,auVar81);
          auVar87 = vsubps_avx512vl(auVar87,auVar88);
          auVar88 = vmulps_avx512vl(auVar81,auVar81);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar80);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar88);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          uVar132 = vcmpps_avx512vl(auVar87,auVar86,2);
          bVar65 = (byte)uVar23 & (byte)uVar132;
          if (bVar65 == 0) {
            auVar179 = ZEXT3264(auVar89);
          }
          else {
            auVar90 = vmulps_avx512vl(local_4a0,auVar90);
            auVar79 = vfmadd213ps_avx512vl(auVar79,local_140,auVar90);
            auVar78 = vfmadd213ps_avx512vl(auVar78,local_120,auVar79);
            auVar77 = vfmadd213ps_avx512vl(auVar77,local_100,auVar78);
            auVar91 = vmulps_avx512vl(local_4a0,auVar91);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar91);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_120,auVar92);
            auVar78 = vfmadd213ps_avx512vl(auVar93,local_100,auVar94);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21ab4f4 + lVar62 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21ab978 + lVar62 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21abdfc + lVar62 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21ac280 + lVar62 * 4);
            auVar79 = vmulps_avx512vl(local_4e0,auVar91);
            auVar90 = vmulps_avx512vl(local_500,auVar91);
            auVar91 = vmulps_avx512vl(local_4a0,auVar91);
            auVar79 = vfmadd231ps_avx512vl(auVar79,auVar92,local_4c0);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar91,local_140,auVar92);
            auVar91 = vfmadd231ps_avx512vl(auVar79,auVar94,auVar89);
            auVar79 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar95);
            auVar94 = vfmadd231ps_avx512vl(auVar92,local_120,auVar94);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar96);
            auVar79 = vfmadd231ps_avx512vl(auVar79,auVar93,local_3e0);
            auVar90 = vfmadd231ps_avx512vl(auVar94,local_100,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21ad914 + lVar62 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21ae21c + lVar62 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21ae6a0 + lVar62 * 4);
            auVar86 = vmulps_avx512vl(local_4e0,auVar92);
            auVar87 = vmulps_avx512vl(local_500,auVar92);
            auVar92 = vmulps_avx512vl(local_4a0,auVar92);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,local_4c0);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar92,local_140,auVar94);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21add98 + lVar62 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,auVar89);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar95);
            auVar94 = vfmadd231ps_avx512vl(auVar92,local_120,auVar94);
            auVar92 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar96);
            auVar86 = vfmadd231ps_avx512vl(auVar87,auVar93,local_3e0);
            auVar94 = vfmadd231ps_avx512vl(auVar94,local_100,auVar93);
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar91,auVar87);
            vandps_avx512vl(auVar79,auVar87);
            auVar93 = vmaxps_avx(auVar87,auVar87);
            vandps_avx512vl(auVar90,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar87);
            uVar66 = vcmpps_avx512vl(auVar93,local_440,1);
            bVar12 = (bool)((byte)uVar66 & 1);
            auVar103._0_4_ = (float)((uint)bVar12 * auVar80._0_4_ | (uint)!bVar12 * auVar91._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar103._4_4_ = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar91._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar103._8_4_ = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar91._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar103._12_4_ =
                 (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar91._12_4_);
            bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar103._16_4_ =
                 (float)((uint)bVar12 * auVar80._16_4_ | (uint)!bVar12 * auVar91._16_4_);
            bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar103._20_4_ =
                 (float)((uint)bVar12 * auVar80._20_4_ | (uint)!bVar12 * auVar91._20_4_);
            bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar103._24_4_ =
                 (float)((uint)bVar12 * auVar80._24_4_ | (uint)!bVar12 * auVar91._24_4_);
            bVar12 = SUB81(uVar66 >> 7,0);
            auVar103._28_4_ = (uint)bVar12 * auVar80._28_4_ | (uint)!bVar12 * auVar91._28_4_;
            bVar12 = (bool)((byte)uVar66 & 1);
            auVar104._0_4_ = (float)((uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar79._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar104._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar79._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar104._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar79._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar104._12_4_ =
                 (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar79._12_4_);
            bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar104._16_4_ =
                 (float)((uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar79._16_4_);
            bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar104._20_4_ =
                 (float)((uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar79._20_4_);
            bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar104._24_4_ =
                 (float)((uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar79._24_4_);
            bVar12 = SUB81(uVar66 >> 7,0);
            auVar104._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar79._28_4_;
            vandps_avx512vl(auVar92,auVar87);
            vandps_avx512vl(auVar86,auVar87);
            auVar93 = vmaxps_avx(auVar104,auVar104);
            vandps_avx512vl(auVar94,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar104);
            uVar66 = vcmpps_avx512vl(auVar93,local_440,1);
            bVar12 = (bool)((byte)uVar66 & 1);
            auVar105._0_4_ = (uint)bVar12 * auVar80._0_4_ | (uint)!bVar12 * auVar92._0_4_;
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar105._4_4_ = (uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar92._4_4_;
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar105._8_4_ = (uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar92._8_4_;
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar105._12_4_ = (uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar92._12_4_;
            bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar105._16_4_ = (uint)bVar12 * auVar80._16_4_ | (uint)!bVar12 * auVar92._16_4_;
            bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar105._20_4_ = (uint)bVar12 * auVar80._20_4_ | (uint)!bVar12 * auVar92._20_4_;
            bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar105._24_4_ = (uint)bVar12 * auVar80._24_4_ | (uint)!bVar12 * auVar92._24_4_;
            bVar12 = SUB81(uVar66 >> 7,0);
            auVar105._28_4_ = (uint)bVar12 * auVar80._28_4_ | (uint)!bVar12 * auVar92._28_4_;
            bVar12 = (bool)((byte)uVar66 & 1);
            auVar106._0_4_ = (float)((uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar86._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar106._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar86._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar106._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar86._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar106._12_4_ =
                 (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar86._12_4_);
            bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar106._16_4_ =
                 (float)((uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar86._16_4_);
            bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar106._20_4_ =
                 (float)((uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar86._20_4_);
            bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar106._24_4_ =
                 (float)((uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar86._24_4_);
            bVar12 = SUB81(uVar66 >> 7,0);
            auVar106._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar86._28_4_;
            auVar168._8_4_ = 0x80000000;
            auVar168._0_8_ = 0x8000000080000000;
            auVar168._12_4_ = 0x80000000;
            auVar168._16_4_ = 0x80000000;
            auVar168._20_4_ = 0x80000000;
            auVar168._24_4_ = 0x80000000;
            auVar168._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar105,auVar168);
            auVar86 = auVar185._0_32_;
            auVar94 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar86);
            auVar184 = vfmadd231ps_fma(auVar94,auVar104,auVar104);
            auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar184));
            auVar178._8_4_ = 0xbf000000;
            auVar178._0_8_ = 0xbf000000bf000000;
            auVar178._12_4_ = 0xbf000000;
            auVar178._16_4_ = 0xbf000000;
            auVar178._20_4_ = 0xbf000000;
            auVar178._24_4_ = 0xbf000000;
            auVar178._28_4_ = 0xbf000000;
            fVar140 = auVar94._0_4_;
            fVar129 = auVar94._4_4_;
            fVar130 = auVar94._8_4_;
            fVar131 = auVar94._12_4_;
            fVar157 = auVar94._16_4_;
            fVar161 = auVar94._20_4_;
            fVar67 = auVar94._24_4_;
            auVar37._4_4_ = fVar129 * fVar129 * fVar129 * auVar184._4_4_ * -0.5;
            auVar37._0_4_ = fVar140 * fVar140 * fVar140 * auVar184._0_4_ * -0.5;
            auVar37._8_4_ = fVar130 * fVar130 * fVar130 * auVar184._8_4_ * -0.5;
            auVar37._12_4_ = fVar131 * fVar131 * fVar131 * auVar184._12_4_ * -0.5;
            auVar37._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
            auVar37._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar37._24_4_ = fVar67 * fVar67 * fVar67 * -0.0;
            auVar37._28_4_ = auVar104._28_4_;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar94 = vfmadd231ps_avx512vl(auVar37,auVar92,auVar94);
            auVar38._4_4_ = auVar104._4_4_ * auVar94._4_4_;
            auVar38._0_4_ = auVar104._0_4_ * auVar94._0_4_;
            auVar38._8_4_ = auVar104._8_4_ * auVar94._8_4_;
            auVar38._12_4_ = auVar104._12_4_ * auVar94._12_4_;
            auVar38._16_4_ = auVar104._16_4_ * auVar94._16_4_;
            auVar38._20_4_ = auVar104._20_4_ * auVar94._20_4_;
            auVar38._24_4_ = auVar104._24_4_ * auVar94._24_4_;
            auVar38._28_4_ = 0;
            auVar39._4_4_ = auVar94._4_4_ * -auVar103._4_4_;
            auVar39._0_4_ = auVar94._0_4_ * -auVar103._0_4_;
            auVar39._8_4_ = auVar94._8_4_ * -auVar103._8_4_;
            auVar39._12_4_ = auVar94._12_4_ * -auVar103._12_4_;
            auVar39._16_4_ = auVar94._16_4_ * -auVar103._16_4_;
            auVar39._20_4_ = auVar94._20_4_ * -auVar103._20_4_;
            auVar39._24_4_ = auVar94._24_4_ * -auVar103._24_4_;
            auVar39._28_4_ = auVar104._28_4_;
            auVar91 = vmulps_avx512vl(auVar94,auVar86);
            auVar94 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar86);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,auVar106);
            auVar79 = vrsqrt14ps_avx512vl(auVar94);
            auVar94 = vmulps_avx512vl(auVar94,auVar178);
            fVar140 = auVar79._0_4_;
            fVar129 = auVar79._4_4_;
            fVar130 = auVar79._8_4_;
            fVar131 = auVar79._12_4_;
            fVar157 = auVar79._16_4_;
            fVar161 = auVar79._20_4_;
            fVar67 = auVar79._24_4_;
            auVar40._4_4_ = fVar129 * fVar129 * fVar129 * auVar94._4_4_;
            auVar40._0_4_ = fVar140 * fVar140 * fVar140 * auVar94._0_4_;
            auVar40._8_4_ = fVar130 * fVar130 * fVar130 * auVar94._8_4_;
            auVar40._12_4_ = fVar131 * fVar131 * fVar131 * auVar94._12_4_;
            auVar40._16_4_ = fVar157 * fVar157 * fVar157 * auVar94._16_4_;
            auVar40._20_4_ = fVar161 * fVar161 * fVar161 * auVar94._20_4_;
            auVar40._24_4_ = fVar67 * fVar67 * fVar67 * auVar94._24_4_;
            auVar40._28_4_ = auVar94._28_4_;
            auVar94 = vfmadd231ps_avx512vl(auVar40,auVar92,auVar79);
            auVar41._4_4_ = auVar106._4_4_ * auVar94._4_4_;
            auVar41._0_4_ = auVar106._0_4_ * auVar94._0_4_;
            auVar41._8_4_ = auVar106._8_4_ * auVar94._8_4_;
            auVar41._12_4_ = auVar106._12_4_ * auVar94._12_4_;
            auVar41._16_4_ = auVar106._16_4_ * auVar94._16_4_;
            auVar41._20_4_ = auVar106._20_4_ * auVar94._20_4_;
            auVar41._24_4_ = auVar106._24_4_ * auVar94._24_4_;
            auVar41._28_4_ = auVar79._28_4_;
            auVar42._4_4_ = auVar94._4_4_ * auVar93._4_4_;
            auVar42._0_4_ = auVar94._0_4_ * auVar93._0_4_;
            auVar42._8_4_ = auVar94._8_4_ * auVar93._8_4_;
            auVar42._12_4_ = auVar94._12_4_ * auVar93._12_4_;
            auVar42._16_4_ = auVar94._16_4_ * auVar93._16_4_;
            auVar42._20_4_ = auVar94._20_4_ * auVar93._20_4_;
            auVar42._24_4_ = auVar94._24_4_ * auVar93._24_4_;
            auVar42._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar94,auVar86);
            auVar184 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar73),auVar82);
            auVar94 = ZEXT1632(auVar73);
            auVar18 = vfmadd213ps_fma(auVar39,auVar94,auVar83);
            auVar92 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar78);
            auVar79 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar71),auVar84);
            auVar75 = vfnmadd213ps_fma(auVar38,auVar94,auVar82);
            auVar90 = ZEXT1632(auVar71);
            auVar74 = vfmadd213ps_fma(auVar42,auVar90,auVar85);
            auVar22 = vfnmadd213ps_fma(auVar39,auVar94,auVar83);
            auVar19 = vfmadd213ps_fma(auVar93,auVar90,auVar77);
            auVar83 = ZEXT1632(auVar73);
            auVar69 = vfnmadd231ps_fma(auVar78,auVar83,auVar91);
            auVar72 = vfnmadd213ps_fma(auVar41,auVar90,auVar84);
            auVar70 = vfnmadd213ps_fma(auVar42,auVar90,auVar85);
            auVar76 = vfnmadd231ps_fma(auVar77,ZEXT1632(auVar71),auVar93);
            auVar77 = vsubps_avx512vl(auVar79,ZEXT1632(auVar75));
            auVar93 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar22));
            auVar94 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar69));
            auVar43._4_4_ = auVar93._4_4_ * auVar69._4_4_;
            auVar43._0_4_ = auVar93._0_4_ * auVar69._0_4_;
            auVar43._8_4_ = auVar93._8_4_ * auVar69._8_4_;
            auVar43._12_4_ = auVar93._12_4_ * auVar69._12_4_;
            auVar43._16_4_ = auVar93._16_4_ * 0.0;
            auVar43._20_4_ = auVar93._20_4_ * 0.0;
            auVar43._24_4_ = auVar93._24_4_ * 0.0;
            auVar43._28_4_ = auVar91._28_4_;
            auVar73 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar22),auVar94);
            auVar44._4_4_ = auVar94._4_4_ * auVar75._4_4_;
            auVar44._0_4_ = auVar94._0_4_ * auVar75._0_4_;
            auVar44._8_4_ = auVar94._8_4_ * auVar75._8_4_;
            auVar44._12_4_ = auVar94._12_4_ * auVar75._12_4_;
            auVar44._16_4_ = auVar94._16_4_ * 0.0;
            auVar44._20_4_ = auVar94._20_4_ * 0.0;
            auVar44._24_4_ = auVar94._24_4_ * 0.0;
            auVar44._28_4_ = auVar94._28_4_;
            auVar20 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar69),auVar77);
            auVar45._4_4_ = auVar22._4_4_ * auVar77._4_4_;
            auVar45._0_4_ = auVar22._0_4_ * auVar77._0_4_;
            auVar45._8_4_ = auVar22._8_4_ * auVar77._8_4_;
            auVar45._12_4_ = auVar22._12_4_ * auVar77._12_4_;
            auVar45._16_4_ = auVar77._16_4_ * 0.0;
            auVar45._20_4_ = auVar77._20_4_ * 0.0;
            auVar45._24_4_ = auVar77._24_4_ * 0.0;
            auVar45._28_4_ = auVar77._28_4_;
            auVar21 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar75),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar86,ZEXT1632(auVar20));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar73));
            uVar66 = vcmpps_avx512vl(auVar93,auVar86,2);
            bVar59 = (byte)uVar66;
            fVar114 = (float)((uint)(bVar59 & 1) * auVar184._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar72._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            fVar116 = (float)((uint)bVar12 * auVar184._4_4_ | (uint)!bVar12 * auVar72._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            fVar119 = (float)((uint)bVar12 * auVar184._8_4_ | (uint)!bVar12 * auVar72._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            fVar120 = (float)((uint)bVar12 * auVar184._12_4_ | (uint)!bVar12 * auVar72._12_4_);
            auVar90 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar119,CONCAT44(fVar116,fVar114))));
            fVar115 = (float)((uint)(bVar59 & 1) * auVar18._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar70._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            fVar118 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar70._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            fVar117 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar70._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            fVar121 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar70._12_4_);
            auVar80 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar117,CONCAT44(fVar118,fVar115))));
            auVar107._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar76._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar76._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar76._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar76._12_4_);
            fVar140 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar92._16_4_);
            auVar107._16_4_ = fVar140;
            fVar130 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar92._20_4_);
            auVar107._20_4_ = fVar130;
            fVar129 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar92._24_4_);
            auVar107._24_4_ = fVar129;
            iVar1 = (uint)(byte)(uVar66 >> 7) * auVar92._28_4_;
            auVar107._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar79);
            auVar108._0_4_ =
                 (uint)(bVar59 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar73._0_4_;
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar108._4_4_ = (uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar73._4_4_;
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar108._8_4_ = (uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar73._8_4_;
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar108._12_4_ = (uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar73._12_4_;
            auVar108._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar93._16_4_;
            auVar108._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar93._20_4_;
            auVar108._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar93._24_4_;
            auVar108._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar74));
            auVar109._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar184._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar184._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar184._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar184._12_4_);
            fVar131 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar93._16_4_);
            auVar109._16_4_ = fVar131;
            fVar157 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar93._20_4_);
            auVar109._20_4_ = fVar157;
            fVar161 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar93._24_4_);
            auVar109._24_4_ = fVar161;
            auVar109._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar19));
            auVar110._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar18._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar18._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar18._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar18._12_4_);
            fVar67 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar93._16_4_);
            auVar110._16_4_ = fVar67;
            fVar68 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar93._20_4_);
            auVar110._20_4_ = fVar68;
            fVar113 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar93._24_4_);
            auVar110._24_4_ = fVar113;
            iVar2 = (uint)(byte)(uVar66 >> 7) * auVar93._28_4_;
            auVar110._28_4_ = iVar2;
            auVar111._0_4_ =
                 (uint)(bVar59 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar79._0_4_
            ;
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar12 * (int)auVar75._4_4_ | (uint)!bVar12 * auVar79._4_4_;
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar12 * (int)auVar75._8_4_ | (uint)!bVar12 * auVar79._8_4_;
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar12 * (int)auVar75._12_4_ | (uint)!bVar12 * auVar79._12_4_;
            auVar111._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar79._16_4_;
            auVar111._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar79._20_4_;
            auVar111._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar79._24_4_;
            auVar111._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar79._28_4_;
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar66 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar66 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar79 = vsubps_avx512vl(auVar111,auVar90);
            auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar22._12_4_ |
                                                    (uint)!bVar16 * auVar74._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar22._8_4_ |
                                                             (uint)!bVar15 * auVar74._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar22._4_4_ |
                                                                      (uint)!bVar12 * auVar74._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar22._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar74._0_4_)))),auVar80);
            auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar69._12_4_ |
                                                    (uint)!bVar17 * auVar19._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar69._8_4_ |
                                                             (uint)!bVar14 * auVar19._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar69._4_4_ |
                                                                      (uint)!bVar13 * auVar19._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar69._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar19._0_4_)))),auVar107);
            auVar91 = vsubps_avx(auVar90,auVar108);
            auVar77 = vsubps_avx(auVar80,auVar109);
            auVar78 = vsubps_avx(auVar107,auVar110);
            auVar46._4_4_ = auVar92._4_4_ * fVar116;
            auVar46._0_4_ = auVar92._0_4_ * fVar114;
            auVar46._8_4_ = auVar92._8_4_ * fVar119;
            auVar46._12_4_ = auVar92._12_4_ * fVar120;
            auVar46._16_4_ = auVar92._16_4_ * 0.0;
            auVar46._20_4_ = auVar92._20_4_ * 0.0;
            auVar46._24_4_ = auVar92._24_4_ * 0.0;
            auVar46._28_4_ = 0;
            auVar73 = vfmsub231ps_fma(auVar46,auVar107,auVar79);
            auVar147._0_4_ = fVar115 * auVar79._0_4_;
            auVar147._4_4_ = fVar118 * auVar79._4_4_;
            auVar147._8_4_ = fVar117 * auVar79._8_4_;
            auVar147._12_4_ = fVar121 * auVar79._12_4_;
            auVar147._16_4_ = auVar79._16_4_ * 0.0;
            auVar147._20_4_ = auVar79._20_4_ * 0.0;
            auVar147._24_4_ = auVar79._24_4_ * 0.0;
            auVar147._28_4_ = 0;
            auVar184 = vfmsub231ps_fma(auVar147,auVar90,auVar94);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar86,ZEXT1632(auVar73));
            auVar152._0_4_ = auVar94._0_4_ * auVar107._0_4_;
            auVar152._4_4_ = auVar94._4_4_ * auVar107._4_4_;
            auVar152._8_4_ = auVar94._8_4_ * auVar107._8_4_;
            auVar152._12_4_ = auVar94._12_4_ * auVar107._12_4_;
            auVar152._16_4_ = auVar94._16_4_ * fVar140;
            auVar152._20_4_ = auVar94._20_4_ * fVar130;
            auVar152._24_4_ = auVar94._24_4_ * fVar129;
            auVar152._28_4_ = 0;
            auVar73 = vfmsub231ps_fma(auVar152,auVar80,auVar92);
            auVar81 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar73));
            auVar93 = vmulps_avx512vl(auVar78,auVar108);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar110);
            auVar47._4_4_ = auVar77._4_4_ * auVar110._4_4_;
            auVar47._0_4_ = auVar77._0_4_ * auVar110._0_4_;
            auVar47._8_4_ = auVar77._8_4_ * auVar110._8_4_;
            auVar47._12_4_ = auVar77._12_4_ * auVar110._12_4_;
            auVar47._16_4_ = auVar77._16_4_ * fVar67;
            auVar47._20_4_ = auVar77._20_4_ * fVar68;
            auVar47._24_4_ = auVar77._24_4_ * fVar113;
            auVar47._28_4_ = iVar2;
            auVar73 = vfmsub231ps_fma(auVar47,auVar109,auVar78);
            auVar153._0_4_ = auVar109._0_4_ * auVar91._0_4_;
            auVar153._4_4_ = auVar109._4_4_ * auVar91._4_4_;
            auVar153._8_4_ = auVar109._8_4_ * auVar91._8_4_;
            auVar153._12_4_ = auVar109._12_4_ * auVar91._12_4_;
            auVar153._16_4_ = fVar131 * auVar91._16_4_;
            auVar153._20_4_ = fVar157 * auVar91._20_4_;
            auVar153._24_4_ = fVar161 * auVar91._24_4_;
            auVar153._28_4_ = 0;
            auVar184 = vfmsub231ps_fma(auVar153,auVar77,auVar108);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar86,auVar93);
            auVar82 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar73));
            auVar93 = vmaxps_avx(auVar81,auVar82);
            uVar132 = vcmpps_avx512vl(auVar93,auVar86,2);
            bVar65 = bVar65 & (byte)uVar132;
            if (bVar65 != 0) {
              uVar122 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar174._4_4_ = uVar122;
              auVar174._0_4_ = uVar122;
              auVar174._8_4_ = uVar122;
              auVar174._12_4_ = uVar122;
              auVar174._16_4_ = uVar122;
              auVar174._20_4_ = uVar122;
              auVar174._24_4_ = uVar122;
              auVar174._28_4_ = uVar122;
              auVar190 = ZEXT3264(auVar174);
              auVar48._4_4_ = auVar78._4_4_ * auVar94._4_4_;
              auVar48._0_4_ = auVar78._0_4_ * auVar94._0_4_;
              auVar48._8_4_ = auVar78._8_4_ * auVar94._8_4_;
              auVar48._12_4_ = auVar78._12_4_ * auVar94._12_4_;
              auVar48._16_4_ = auVar78._16_4_ * auVar94._16_4_;
              auVar48._20_4_ = auVar78._20_4_ * auVar94._20_4_;
              auVar48._24_4_ = auVar78._24_4_ * auVar94._24_4_;
              auVar48._28_4_ = auVar93._28_4_;
              auVar18 = vfmsub231ps_fma(auVar48,auVar77,auVar92);
              auVar49._4_4_ = auVar92._4_4_ * auVar91._4_4_;
              auVar49._0_4_ = auVar92._0_4_ * auVar91._0_4_;
              auVar49._8_4_ = auVar92._8_4_ * auVar91._8_4_;
              auVar49._12_4_ = auVar92._12_4_ * auVar91._12_4_;
              auVar49._16_4_ = auVar92._16_4_ * auVar91._16_4_;
              auVar49._20_4_ = auVar92._20_4_ * auVar91._20_4_;
              auVar49._24_4_ = auVar92._24_4_ * auVar91._24_4_;
              auVar49._28_4_ = auVar92._28_4_;
              auVar184 = vfmsub231ps_fma(auVar49,auVar79,auVar78);
              auVar50._4_4_ = auVar77._4_4_ * auVar79._4_4_;
              auVar50._0_4_ = auVar77._0_4_ * auVar79._0_4_;
              auVar50._8_4_ = auVar77._8_4_ * auVar79._8_4_;
              auVar50._12_4_ = auVar77._12_4_ * auVar79._12_4_;
              auVar50._16_4_ = auVar77._16_4_ * auVar79._16_4_;
              auVar50._20_4_ = auVar77._20_4_ * auVar79._20_4_;
              auVar50._24_4_ = auVar77._24_4_ * auVar79._24_4_;
              auVar50._28_4_ = auVar77._28_4_;
              auVar74 = vfmsub231ps_fma(auVar50,auVar91,auVar94);
              auVar73 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar184),ZEXT1632(auVar74));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar18),auVar86);
              auVar94 = vrcp14ps_avx512vl(auVar93);
              auVar91 = auVar181._0_32_;
              auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar91);
              auVar73 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
              auVar51._4_4_ = auVar74._4_4_ * auVar107._4_4_;
              auVar51._0_4_ = auVar74._0_4_ * auVar107._0_4_;
              auVar51._8_4_ = auVar74._8_4_ * auVar107._8_4_;
              auVar51._12_4_ = auVar74._12_4_ * auVar107._12_4_;
              auVar51._16_4_ = fVar140 * 0.0;
              auVar51._20_4_ = fVar130 * 0.0;
              auVar51._24_4_ = fVar129 * 0.0;
              auVar51._28_4_ = iVar1;
              auVar184 = vfmadd231ps_fma(auVar51,auVar80,ZEXT1632(auVar184));
              auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar90,ZEXT1632(auVar18));
              fVar140 = auVar73._0_4_;
              fVar129 = auVar73._4_4_;
              fVar130 = auVar73._8_4_;
              fVar131 = auVar73._12_4_;
              local_240 = ZEXT1632(CONCAT412(auVar184._12_4_ * fVar131,
                                             CONCAT48(auVar184._8_4_ * fVar130,
                                                      CONCAT44(auVar184._4_4_ * fVar129,
                                                               auVar184._0_4_ * fVar140))));
              uVar132 = vcmpps_avx512vl(local_240,auVar174,2);
              auVar58._4_4_ = uStack_37c;
              auVar58._0_4_ = local_380;
              auVar58._8_4_ = uStack_378;
              auVar58._12_4_ = uStack_374;
              auVar58._16_4_ = uStack_370;
              auVar58._20_4_ = uStack_36c;
              auVar58._24_4_ = uStack_368;
              auVar58._28_4_ = uStack_364;
              uVar23 = vcmpps_avx512vl(local_240,auVar58,0xd);
              bVar65 = (byte)uVar132 & (byte)uVar23 & bVar65;
              if (bVar65 != 0) {
                uVar132 = vcmpps_avx512vl(auVar93,auVar86,4);
                bVar65 = bVar65 & (byte)uVar132;
                auVar175 = ZEXT1664(local_5e0);
                auVar179 = ZEXT3264(local_560);
                auVar180 = ZEXT3264(local_520);
                if (bVar65 != 0) {
                  fVar157 = auVar81._0_4_ * fVar140;
                  fVar161 = auVar81._4_4_ * fVar129;
                  auVar52._4_4_ = fVar161;
                  auVar52._0_4_ = fVar157;
                  fVar67 = auVar81._8_4_ * fVar130;
                  auVar52._8_4_ = fVar67;
                  fVar68 = auVar81._12_4_ * fVar131;
                  auVar52._12_4_ = fVar68;
                  fVar113 = auVar81._16_4_ * 0.0;
                  auVar52._16_4_ = fVar113;
                  fVar114 = auVar81._20_4_ * 0.0;
                  auVar52._20_4_ = fVar114;
                  fVar115 = auVar81._24_4_ * 0.0;
                  auVar52._24_4_ = fVar115;
                  auVar52._28_4_ = auVar93._28_4_;
                  auVar94 = vsubps_avx512vl(auVar91,auVar52);
                  local_280._0_4_ =
                       (float)((uint)(bVar59 & 1) * (int)fVar157 |
                              (uint)!(bool)(bVar59 & 1) * auVar94._0_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                  local_280._4_4_ =
                       (float)((uint)bVar12 * (int)fVar161 | (uint)!bVar12 * auVar94._4_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                  local_280._8_4_ =
                       (float)((uint)bVar12 * (int)fVar67 | (uint)!bVar12 * auVar94._8_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                  local_280._12_4_ =
                       (float)((uint)bVar12 * (int)fVar68 | (uint)!bVar12 * auVar94._12_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                  local_280._16_4_ =
                       (float)((uint)bVar12 * (int)fVar113 | (uint)!bVar12 * auVar94._16_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                  local_280._20_4_ =
                       (float)((uint)bVar12 * (int)fVar114 | (uint)!bVar12 * auVar94._20_4_);
                  bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                  local_280._24_4_ =
                       (float)((uint)bVar12 * (int)fVar115 | (uint)!bVar12 * auVar94._24_4_);
                  bVar12 = SUB81(uVar66 >> 7,0);
                  local_280._28_4_ =
                       (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar94._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar71),auVar83);
                  auVar73 = vfmadd213ps_fma(auVar93,local_280,auVar83);
                  uVar122 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                  auVar28._4_4_ = uVar122;
                  auVar28._0_4_ = uVar122;
                  auVar28._8_4_ = uVar122;
                  auVar28._12_4_ = uVar122;
                  auVar28._16_4_ = uVar122;
                  auVar28._20_4_ = uVar122;
                  auVar28._24_4_ = uVar122;
                  auVar28._28_4_ = uVar122;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                                               CONCAT48(auVar73._8_4_ +
                                                                        auVar73._8_4_,
                                                                        CONCAT44(auVar73._4_4_ +
                                                                                 auVar73._4_4_,
                                                                                 auVar73._0_4_ +
                                                                                 auVar73._0_4_)))),
                                            auVar28);
                  uVar132 = vcmpps_avx512vl(local_240,auVar93,6);
                  if (((byte)uVar132 & bVar65) != 0) {
                    auVar135._0_4_ = auVar82._0_4_ * fVar140;
                    auVar135._4_4_ = auVar82._4_4_ * fVar129;
                    auVar135._8_4_ = auVar82._8_4_ * fVar130;
                    auVar135._12_4_ = auVar82._12_4_ * fVar131;
                    auVar135._16_4_ = auVar82._16_4_ * 0.0;
                    auVar135._20_4_ = auVar82._20_4_ * 0.0;
                    auVar135._24_4_ = auVar82._24_4_ * 0.0;
                    auVar135._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar91,auVar135);
                    auVar112._0_4_ =
                         (uint)(bVar59 & 1) * (int)auVar135._0_4_ |
                         (uint)!(bool)(bVar59 & 1) * auVar93._0_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                    auVar112._4_4_ =
                         (uint)bVar12 * (int)auVar135._4_4_ | (uint)!bVar12 * auVar93._4_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                    auVar112._8_4_ =
                         (uint)bVar12 * (int)auVar135._8_4_ | (uint)!bVar12 * auVar93._8_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                    auVar112._12_4_ =
                         (uint)bVar12 * (int)auVar135._12_4_ | (uint)!bVar12 * auVar93._12_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                    auVar112._16_4_ =
                         (uint)bVar12 * (int)auVar135._16_4_ | (uint)!bVar12 * auVar93._16_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                    auVar112._20_4_ =
                         (uint)bVar12 * (int)auVar135._20_4_ | (uint)!bVar12 * auVar93._20_4_;
                    bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                    auVar112._24_4_ =
                         (uint)bVar12 * (int)auVar135._24_4_ | (uint)!bVar12 * auVar93._24_4_;
                    auVar112._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar93._28_4_;
                    auVar29._8_4_ = 0x40000000;
                    auVar29._0_8_ = 0x4000000040000000;
                    auVar29._12_4_ = 0x40000000;
                    auVar29._16_4_ = 0x40000000;
                    auVar29._20_4_ = 0x40000000;
                    auVar29._24_4_ = 0x40000000;
                    auVar29._28_4_ = 0x40000000;
                    local_260 = vfmsub132ps_avx512vl(auVar112,auVar91,auVar29);
                    local_220 = (undefined4)lVar62;
                    local_210 = local_5e0;
                    local_200 = local_5c0;
                    uStack_1f8 = uStack_5b8;
                    local_1f0 = local_5d0;
                    uStack_1e8 = uStack_5c8;
                    pGVar10 = (context->scene->geometries).items[local_5e8].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar59 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar59 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar73 = vcvtsi2ss_avx512f(auVar181._0_16_,local_220);
                      fVar140 = auVar73._0_4_;
                      local_1c0[0] = (fVar140 + local_280._0_4_ + 0.0) * (float)local_2c0;
                      local_1c0[1] = (fVar140 + local_280._4_4_ + 1.0) * local_2c0._4_4_;
                      local_1c0[2] = (fVar140 + local_280._8_4_ + 2.0) * fStack_2b8;
                      local_1c0[3] = (fVar140 + local_280._12_4_ + 3.0) * fStack_2b4;
                      fStack_1b0 = (fVar140 + local_280._16_4_ + 4.0) * fStack_2b0;
                      fStack_1ac = (fVar140 + local_280._20_4_ + 5.0) * fStack_2ac;
                      fStack_1a8 = (fVar140 + local_280._24_4_ + 6.0) * fStack_2a8;
                      fStack_1a4 = fVar140 + local_280._28_4_ + 7.0;
                      local_1a0 = local_260;
                      local_180 = local_240;
                      uVar66 = CONCAT71(0,(byte)uVar132 & bVar65);
                      local_460._0_8_ = uVar66;
                      lVar25 = 0;
                      for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_5a0._0_8_ = lVar25;
                      local_160 = auVar174;
                      local_5b0._0_8_ = pGVar10;
                      local_21c = iVar9;
                      do {
                        auVar184 = auVar185._0_16_;
                        local_320 = local_1c0[local_5a0._0_8_];
                        local_310 = *(undefined4 *)(local_1a0 + local_5a0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + local_5a0._0_8_ * 4);
                        local_590.context = context->user;
                        fVar129 = 1.0 - local_320;
                        fVar140 = fVar129 * fVar129 * -3.0;
                        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129)),
                                                  ZEXT416((uint)(local_320 * fVar129)),
                                                  ZEXT416(0xc0000000));
                        auVar71 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar129)),
                                                  ZEXT416((uint)(local_320 * local_320)),
                                                  ZEXT416(0x40000000));
                        fVar129 = auVar73._0_4_ * 3.0;
                        fVar130 = auVar71._0_4_ * 3.0;
                        fVar131 = local_320 * local_320 * 3.0;
                        auVar156._0_4_ = fVar131 * local_480;
                        auVar156._4_4_ = fVar131 * fStack_47c;
                        auVar156._8_4_ = fVar131 * fStack_478;
                        auVar156._12_4_ = fVar131 * fStack_474;
                        auVar127._4_4_ = fVar130;
                        auVar127._0_4_ = fVar130;
                        auVar127._8_4_ = fVar130;
                        auVar127._12_4_ = fVar130;
                        auVar54._8_8_ = uStack_5c8;
                        auVar54._0_8_ = local_5d0;
                        auVar73 = vfmadd132ps_fma(auVar127,auVar156,auVar54);
                        auVar146._4_4_ = fVar129;
                        auVar146._0_4_ = fVar129;
                        auVar146._8_4_ = fVar129;
                        auVar146._12_4_ = fVar129;
                        auVar56._8_8_ = uStack_5b8;
                        auVar56._0_8_ = local_5c0;
                        auVar73 = vfmadd132ps_fma(auVar146,auVar73,auVar56);
                        auVar128._4_4_ = fVar140;
                        auVar128._0_4_ = fVar140;
                        auVar128._8_4_ = fVar140;
                        auVar128._12_4_ = fVar140;
                        auVar73 = vfmadd213ps_fma(auVar128,auVar175._0_16_,auVar73);
                        local_350 = auVar73._0_4_;
                        local_340 = vshufps_avx(auVar73,auVar73,0x55);
                        local_330 = vshufps_avx(auVar73,auVar73,0xaa);
                        local_300 = local_530._0_8_;
                        uStack_2f8 = local_530._8_8_;
                        local_2f0 = local_540;
                        vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                        uStack_2dc = (local_590.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_590.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_600 = local_390;
                        local_590.valid = (int *)local_600;
                        local_590.geometryUserPtr = *(void **)(local_5b0._0_8_ + 0x18);
                        local_590.hit = (RTCHitN *)&local_350;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        fStack_31c = local_320;
                        fStack_318 = local_320;
                        fStack_314 = local_320;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (*(code **)(local_5b0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_5b0._0_8_ + 0x48))(&local_590);
                          auVar190 = ZEXT3264(local_160);
                          auVar187 = ZEXT3264(local_420);
                          auVar180 = ZEXT3264(local_520);
                          auVar179 = ZEXT3264(local_560);
                          auVar183 = ZEXT3264(local_3e0);
                          auVar182 = ZEXT3264(local_400);
                          auVar175 = ZEXT1664(local_5e0);
                          auVar73 = vxorps_avx512vl(auVar184,auVar184);
                          auVar185 = ZEXT1664(auVar73);
                        }
                        auVar73 = auVar185._0_16_;
                        uVar66 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar66 & 0xf) == 0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar181 = ZEXT3264(auVar93);
                          auVar186 = ZEXT3264(local_4c0);
                          auVar188 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_5b0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var11)(&local_590);
                            auVar190 = ZEXT3264(local_160);
                            auVar187 = ZEXT3264(local_420);
                            auVar180 = ZEXT3264(local_520);
                            auVar179 = ZEXT3264(local_560);
                            auVar183 = ZEXT3264(local_3e0);
                            auVar182 = ZEXT3264(local_400);
                            auVar175 = ZEXT1664(local_5e0);
                            auVar73 = vxorps_avx512vl(auVar73,auVar73);
                            auVar185 = ZEXT1664(auVar73);
                          }
                          uVar66 = vptestmd_avx512vl(local_600,local_600);
                          uVar66 = uVar66 & 0xf;
                          auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar66 & 1);
                          bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar14 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_590.ray + 0x80) =
                               (uint)bVar12 * auVar73._0_4_ |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                          *(uint *)(local_590.ray + 0x84) =
                               (uint)bVar13 * auVar73._4_4_ |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                          *(uint *)(local_590.ray + 0x88) =
                               (uint)bVar15 * auVar73._8_4_ |
                               (uint)!bVar15 * *(int *)(local_590.ray + 0x88);
                          *(uint *)(local_590.ray + 0x8c) =
                               (uint)bVar14 * auVar73._12_4_ |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x8c);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar181 = ZEXT3264(auVar93);
                          auVar186 = ZEXT3264(local_4c0);
                          auVar188 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                          if ((byte)uVar66 != 0) {
                            bVar59 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar190._0_4_;
                        local_460._0_8_ = local_460._0_8_ ^ 1L << (local_5a0._0_8_ & 0x3f);
                        bVar59 = 0;
                        lVar25 = 0;
                        for (uVar66 = local_460._0_8_; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        local_5a0._0_8_ = lVar25;
                      } while (local_460._0_8_ != 0);
                    }
                    bVar61 = (bool)(bVar61 | bVar59);
                  }
                }
                goto LAB_01b09bb1;
              }
            }
            auVar179 = ZEXT3264(local_560);
            auVar180 = ZEXT3264(local_520);
          }
LAB_01b09bb1:
          lVar62 = lVar62 + 8;
        } while ((int)lVar62 < iVar9);
      }
      if (bVar61) {
        return bVar61;
      }
      uVar122 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar26._4_4_ = uVar122;
      auVar26._0_4_ = uVar122;
      auVar26._8_4_ = uVar122;
      auVar26._12_4_ = uVar122;
      uVar132 = vcmpps_avx512vl(local_290,auVar26,2);
      uVar63 = (uint)uVar64 & (uint)uVar132;
      uVar64 = (ulong)uVar63;
    } while (uVar63 != 0);
  }
  return bVar61;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }